

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

bool embree::avx512::CurveNiMBIntersector1<4>::
     occluded_t<embree::avx512::RibbonCurve1Intersector1<embree::BezierCurveT,8>,embree::avx512::Occluded1EpilogMU<8,true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  float *pfVar4;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar7;
  undefined1 auVar8 [16];
  int iVar9;
  Geometry *pGVar10;
  __int_type_conflict _Var11;
  long lVar12;
  RTCFilterFunctionN p_Var13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined8 uVar22;
  ulong uVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  byte bVar57;
  ulong uVar58;
  ulong uVar59;
  long lVar60;
  Geometry *geometry;
  long lVar61;
  long lVar62;
  undefined8 unaff_R13;
  ulong uVar63;
  bool bVar64;
  byte bVar65;
  float fVar66;
  float fVar67;
  float fVar127;
  float fVar129;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  float fVar128;
  float fVar130;
  float fVar132;
  float fVar133;
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  float fVar131;
  float fVar134;
  float fVar135;
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined4 uVar136;
  vint4 bi_2;
  undefined1 auVar137 [16];
  undefined1 auVar138 [32];
  undefined8 uVar139;
  vint4 bi_1;
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [32];
  float fVar146;
  vint4 bi;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  vint4 ai;
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  float fVar164;
  float fVar165;
  vint4 ai_1;
  vint4 ai_2;
  undefined1 auVar166 [16];
  undefined1 auVar167 [32];
  float fVar169;
  undefined1 auVar168 [16];
  float fVar170;
  float fVar171;
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [32];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [64];
  undefined1 auVar189 [64];
  undefined1 auVar190 [64];
  undefined1 auVar191 [64];
  undefined1 auVar192 [64];
  undefined1 auVar193 [64];
  undefined1 auVar194 [64];
  undefined1 auVar195 [64];
  undefined1 auVar196 [64];
  undefined1 auVar197 [64];
  RTCFilterFunctionNArguments args;
  int local_544;
  RayQueryContext *local_540;
  long local_538;
  Ray *local_530;
  ulong local_528;
  Precalculations *local_520;
  float local_514;
  RTCFilterFunctionNArguments local_510;
  undefined8 local_4e0;
  undefined4 local_4d8;
  float local_4d4;
  undefined4 local_4d0;
  undefined4 local_4cc;
  undefined4 local_4c8;
  uint local_4c4;
  uint local_4c0;
  Geometry *local_4b0;
  ulong local_4a8;
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [16];
  undefined1 local_3f0 [16];
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  ulong local_370;
  Primitive *local_368;
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_310 [8];
  float fStack_308;
  float fStack_304;
  undefined1 local_300 [8];
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  undefined1 local_2e0 [32];
  float local_2c0;
  float fStack_2bc;
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  undefined1 local_2a0 [32];
  undefined1 local_270 [16];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined4 local_200;
  int local_1fc;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  float local_1a0 [4];
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  undefined4 uStack_c4;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  local_540 = context;
  local_520 = pre;
  uVar58 = (ulong)(byte)prim[1];
  auVar77 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar58 * 4 + 6)));
  auVar76 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar58 * 5 + 6)));
  auVar73 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar58 * 6 + 6)));
  auVar74 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar58 * 0xf + 6)));
  lVar61 = uVar58 * 0x25;
  auVar75 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)prim[1] * 0x10 + 6)));
  auVar78 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar58 * 0x11 + 6)));
  auVar79 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar58 * 0x1a + 6)));
  auVar88 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar58 * 0x1b + 6)));
  fVar164 = *(float *)(prim + lVar61 + 0x12);
  auVar71 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                       *(undefined1 (*) [16])(prim + lVar61 + 6));
  auVar20 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar58 * 0x1c + 6)));
  fVar146 = ((ray->dir).field_0.m128[3] - *(float *)(prim + lVar61 + 0x16)) *
            *(float *)(prim + lVar61 + 0x1a);
  auVar86._8_8_ = 0;
  auVar86._0_8_ = *(ulong *)(prim + uVar58 * 7 + 6);
  auVar21 = vpmovsxwd_avx(auVar86);
  auVar85._8_8_ = 0;
  auVar85._0_8_ = *(ulong *)(prim + uVar58 * 0xb + 6);
  auVar89 = vpmovsxwd_avx(auVar85);
  auVar87._8_8_ = 0;
  auVar87._0_8_ = *(ulong *)(prim + uVar58 * 9 + 6);
  auVar137 = vpmovsxwd_avx(auVar87);
  auVar68 = vpbroadcastd_avx512vl();
  auVar80._8_8_ = 0;
  auVar80._0_8_ = *(ulong *)(prim + uVar58 * 0xd + 6);
  auVar69 = vpmovsxwd_avx512vl(auVar80);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar58 * 0x12 + 6);
  auVar70 = vpmovsxwd_avx512vl(auVar8);
  auVar185._0_4_ = fVar164 * auVar71._0_4_;
  auVar185._4_4_ = fVar164 * auVar71._4_4_;
  auVar185._8_4_ = fVar164 * auVar71._8_4_;
  auVar185._12_4_ = fVar164 * auVar71._12_4_;
  auVar184._0_4_ = fVar164 * (ray->dir).field_0.m128[0];
  auVar184._4_4_ = fVar164 * (ray->dir).field_0.m128[1];
  auVar184._8_4_ = fVar164 * (ray->dir).field_0.m128[2];
  auVar184._12_4_ = fVar164 * (ray->dir).field_0.m128[3];
  auVar71 = vcvtdq2ps_avx512vl(auVar77);
  auVar72 = vcvtdq2ps_avx512vl(auVar76);
  auVar73 = vcvtdq2ps_avx512vl(auVar73);
  auVar74 = vcvtdq2ps_avx512vl(auVar74);
  auVar75 = vcvtdq2ps_avx512vl(auVar75);
  auVar86 = vcvtdq2ps_avx(auVar78);
  auVar85 = vcvtdq2ps_avx(auVar79);
  auVar87 = vcvtdq2ps_avx(auVar88);
  auVar80 = vcvtdq2ps_avx(auVar20);
  auVar172._4_4_ = auVar184._0_4_;
  auVar172._0_4_ = auVar184._0_4_;
  auVar172._8_4_ = auVar184._0_4_;
  auVar172._12_4_ = auVar184._0_4_;
  auVar8 = vshufps_avx(auVar184,auVar184,0x55);
  auVar77 = vshufps_avx(auVar184,auVar184,0xaa);
  auVar76 = vmulps_avx512vl(auVar77,auVar73);
  auVar140._0_4_ = auVar77._0_4_ * auVar86._0_4_;
  auVar140._4_4_ = auVar77._4_4_ * auVar86._4_4_;
  auVar140._8_4_ = auVar77._8_4_ * auVar86._8_4_;
  auVar140._12_4_ = auVar77._12_4_ * auVar86._12_4_;
  auVar81._0_4_ = auVar80._0_4_ * auVar77._0_4_;
  auVar81._4_4_ = auVar80._4_4_ * auVar77._4_4_;
  auVar81._8_4_ = auVar80._8_4_ * auVar77._8_4_;
  auVar81._12_4_ = auVar80._12_4_ * auVar77._12_4_;
  auVar77 = vfmadd231ps_avx512vl(auVar76,auVar8,auVar72);
  auVar76 = vfmadd231ps_avx512vl(auVar140,auVar8,auVar75);
  auVar8 = vfmadd231ps_fma(auVar81,auVar87,auVar8);
  auVar78 = vfmadd231ps_avx512vl(auVar77,auVar172,auVar71);
  auVar79 = vfmadd231ps_avx512vl(auVar76,auVar172,auVar74);
  auVar76 = vfmadd231ps_fma(auVar8,auVar85,auVar172);
  auVar182._4_4_ = auVar185._0_4_;
  auVar182._0_4_ = auVar185._0_4_;
  auVar182._8_4_ = auVar185._0_4_;
  auVar182._12_4_ = auVar185._0_4_;
  auVar8 = vshufps_avx(auVar185,auVar185,0x55);
  auVar77 = vshufps_avx(auVar185,auVar185,0xaa);
  auVar73 = vmulps_avx512vl(auVar77,auVar73);
  auVar173._0_4_ = auVar77._0_4_ * auVar86._0_4_;
  auVar173._4_4_ = auVar77._4_4_ * auVar86._4_4_;
  auVar173._8_4_ = auVar77._8_4_ * auVar86._8_4_;
  auVar173._12_4_ = auVar77._12_4_ * auVar86._12_4_;
  auVar151._0_4_ = auVar77._0_4_ * auVar80._0_4_;
  auVar151._4_4_ = auVar77._4_4_ * auVar80._4_4_;
  auVar151._8_4_ = auVar77._8_4_ * auVar80._8_4_;
  auVar151._12_4_ = auVar77._12_4_ * auVar80._12_4_;
  auVar80 = vfmadd231ps_avx512vl(auVar73,auVar8,auVar72);
  auVar77 = vfmadd231ps_avx512vl(auVar173,auVar8,auVar75);
  auVar86 = vfmadd231ps_fma(auVar151,auVar8,auVar87);
  auVar72 = vfmadd231ps_avx512vl(auVar80,auVar182,auVar71);
  auVar81 = vfmadd231ps_avx512vl(auVar77,auVar182,auVar74);
  auVar71 = vfmadd231ps_fma(auVar86,auVar182,auVar85);
  auVar180._8_4_ = 0x7fffffff;
  auVar180._0_8_ = 0x7fffffff7fffffff;
  auVar180._12_4_ = 0x7fffffff;
  auVar86 = vandps_avx(auVar180,auVar78);
  auVar178._8_4_ = 0x219392ef;
  auVar178._0_8_ = 0x219392ef219392ef;
  auVar178._12_4_ = 0x219392ef;
  uVar63 = vcmpps_avx512vl(auVar86,auVar178,1);
  bVar64 = (bool)((byte)uVar63 & 1);
  auVar82._0_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar78._0_4_;
  bVar64 = (bool)((byte)(uVar63 >> 1) & 1);
  auVar82._4_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar78._4_4_;
  bVar64 = (bool)((byte)(uVar63 >> 2) & 1);
  auVar82._8_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar78._8_4_;
  bVar64 = (bool)((byte)(uVar63 >> 3) & 1);
  auVar82._12_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar78._12_4_;
  auVar86 = vandps_avx(auVar180,auVar79);
  uVar63 = vcmpps_avx512vl(auVar86,auVar178,1);
  bVar64 = (bool)((byte)uVar63 & 1);
  auVar83._0_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar79._0_4_;
  bVar64 = (bool)((byte)(uVar63 >> 1) & 1);
  auVar83._4_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar79._4_4_;
  bVar64 = (bool)((byte)(uVar63 >> 2) & 1);
  auVar83._8_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar79._8_4_;
  bVar64 = (bool)((byte)(uVar63 >> 3) & 1);
  auVar83._12_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar79._12_4_;
  auVar86 = vandps_avx(auVar180,auVar76);
  uVar63 = vcmpps_avx512vl(auVar86,auVar178,1);
  bVar64 = (bool)((byte)uVar63 & 1);
  auVar84._0_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar76._0_4_;
  bVar64 = (bool)((byte)(uVar63 >> 1) & 1);
  auVar84._4_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar76._4_4_;
  bVar64 = (bool)((byte)(uVar63 >> 2) & 1);
  auVar84._8_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar76._8_4_;
  bVar64 = (bool)((byte)(uVar63 >> 3) & 1);
  auVar84._12_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar76._12_4_;
  auVar176._8_4_ = 0x3f800000;
  auVar176._0_8_ = 0x3f8000003f800000;
  auVar176._12_4_ = 0x3f800000;
  auVar85 = vrcp14ps_avx512vl(auVar82);
  auVar86 = vfnmadd213ps_fma(auVar82,auVar85,auVar176);
  auVar87 = vfmadd132ps_fma(auVar86,auVar85,auVar85);
  auVar85 = vrcp14ps_avx512vl(auVar83);
  auVar86 = vfnmadd213ps_fma(auVar83,auVar85,auVar176);
  auVar80 = vfmadd132ps_fma(auVar86,auVar85,auVar85);
  auVar85 = vrcp14ps_avx512vl(auVar84);
  auVar86 = vfnmadd213ps_fma(auVar84,auVar85,auVar176);
  auVar8 = vfmadd132ps_fma(auVar86,auVar85,auVar85);
  auVar160._4_4_ = fVar146;
  auVar160._0_4_ = fVar146;
  auVar160._8_4_ = fVar146;
  auVar160._12_4_ = fVar146;
  auVar86 = vcvtdq2ps_avx(auVar21);
  auVar85 = vcvtdq2ps_avx(auVar89);
  auVar85 = vsubps_avx(auVar85,auVar86);
  auVar88 = vfmadd213ps_fma(auVar85,auVar160,auVar86);
  auVar86 = vcvtdq2ps_avx(auVar137);
  auVar85 = vcvtdq2ps_avx512vl(auVar69);
  auVar85 = vsubps_avx(auVar85,auVar86);
  auVar20 = vfmadd213ps_fma(auVar85,auVar160,auVar86);
  auVar85 = vcvtdq2ps_avx512vl(auVar70);
  auVar77._8_8_ = 0;
  auVar77._0_8_ = *(ulong *)(prim + uVar58 * 0x16 + 6);
  auVar86 = vpmovsxwd_avx(auVar77);
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar86 = vsubps_avx(auVar86,auVar85);
  auVar77 = vfmadd213ps_fma(auVar86,auVar160,auVar85);
  auVar76._8_8_ = 0;
  auVar76._0_8_ = *(ulong *)(prim + uVar58 * 0x14 + 6);
  auVar86 = vpmovsxwd_avx(auVar76);
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar73._8_8_ = 0;
  auVar73._0_8_ = *(ulong *)(prim + uVar58 * 0x18 + 6);
  auVar85 = vpmovsxwd_avx(auVar73);
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar85 = vsubps_avx(auVar85,auVar86);
  auVar76 = vfmadd213ps_fma(auVar85,auVar160,auVar86);
  auVar74._8_8_ = 0;
  auVar74._0_8_ = *(ulong *)(prim + uVar58 * 0x1d + 6);
  auVar86 = vpmovsxwd_avx(auVar74);
  auVar75._8_8_ = 0;
  auVar75._0_8_ = *(ulong *)(prim + uVar58 * 0x21 + 6);
  auVar85 = vpmovsxwd_avx(auVar75);
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar85 = vsubps_avx(auVar85,auVar86);
  auVar73 = vfmadd213ps_fma(auVar85,auVar160,auVar86);
  auVar78._8_8_ = 0;
  auVar78._0_8_ = *(ulong *)(prim + uVar58 * 0x1f + 6);
  auVar86 = vpmovsxwd_avx(auVar78);
  auVar86 = vcvtdq2ps_avx(auVar86);
  local_368 = prim;
  auVar79._8_8_ = 0;
  auVar79._0_8_ = *(ulong *)(prim + uVar58 * 0x23 + 6);
  auVar85 = vpmovsxwd_avx(auVar79);
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar85 = vsubps_avx(auVar85,auVar86);
  auVar85 = vfmadd213ps_fma(auVar85,auVar160,auVar86);
  auVar86 = vsubps_avx512vl(auVar88,auVar72);
  auVar161._0_4_ = auVar87._0_4_ * auVar86._0_4_;
  auVar161._4_4_ = auVar87._4_4_ * auVar86._4_4_;
  auVar161._8_4_ = auVar87._8_4_ * auVar86._8_4_;
  auVar161._12_4_ = auVar87._12_4_ * auVar86._12_4_;
  auVar86 = vsubps_avx512vl(auVar20,auVar72);
  auVar70._0_4_ = auVar87._0_4_ * auVar86._0_4_;
  auVar70._4_4_ = auVar87._4_4_ * auVar86._4_4_;
  auVar70._8_4_ = auVar87._8_4_ * auVar86._8_4_;
  auVar70._12_4_ = auVar87._12_4_ * auVar86._12_4_;
  auVar86 = vsubps_avx(auVar77,auVar81);
  auVar72._0_4_ = auVar80._0_4_ * auVar86._0_4_;
  auVar72._4_4_ = auVar80._4_4_ * auVar86._4_4_;
  auVar72._8_4_ = auVar80._8_4_ * auVar86._8_4_;
  auVar72._12_4_ = auVar80._12_4_ * auVar86._12_4_;
  auVar86 = vsubps_avx(auVar76,auVar81);
  auVar69._0_4_ = auVar80._0_4_ * auVar86._0_4_;
  auVar69._4_4_ = auVar80._4_4_ * auVar86._4_4_;
  auVar69._8_4_ = auVar80._8_4_ * auVar86._8_4_;
  auVar69._12_4_ = auVar80._12_4_ * auVar86._12_4_;
  auVar86 = vsubps_avx(auVar73,auVar71);
  auVar166._0_4_ = auVar8._0_4_ * auVar86._0_4_;
  auVar166._4_4_ = auVar8._4_4_ * auVar86._4_4_;
  auVar166._8_4_ = auVar8._8_4_ * auVar86._8_4_;
  auVar166._12_4_ = auVar8._12_4_ * auVar86._12_4_;
  auVar86 = vsubps_avx(auVar85,auVar71);
  auVar137._0_4_ = auVar8._0_4_ * auVar86._0_4_;
  auVar137._4_4_ = auVar8._4_4_ * auVar86._4_4_;
  auVar137._8_4_ = auVar8._8_4_ * auVar86._8_4_;
  auVar137._12_4_ = auVar8._12_4_ * auVar86._12_4_;
  auVar86 = vpminsd_avx(auVar161,auVar70);
  auVar85 = vpminsd_avx(auVar72,auVar69);
  auVar86 = vmaxps_avx(auVar86,auVar85);
  auVar85 = vpminsd_avx(auVar166,auVar137);
  uVar136 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar88._4_4_ = uVar136;
  auVar88._0_4_ = uVar136;
  auVar88._8_4_ = uVar136;
  auVar88._12_4_ = uVar136;
  auVar85 = vmaxps_avx512vl(auVar85,auVar88);
  auVar86 = vmaxps_avx(auVar86,auVar85);
  auVar20._8_4_ = 0x3f7ffffa;
  auVar20._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar20._12_4_ = 0x3f7ffffa;
  local_270 = vmulps_avx512vl(auVar86,auVar20);
  auVar86 = vpmaxsd_avx(auVar161,auVar70);
  auVar85 = vpmaxsd_avx(auVar72,auVar69);
  auVar86 = vminps_avx(auVar86,auVar85);
  auVar85 = vpmaxsd_avx(auVar166,auVar137);
  fVar164 = ray->tfar;
  auVar21._4_4_ = fVar164;
  auVar21._0_4_ = fVar164;
  auVar21._8_4_ = fVar164;
  auVar21._12_4_ = fVar164;
  auVar85 = vminps_avx512vl(auVar85,auVar21);
  auVar86 = vminps_avx(auVar86,auVar85);
  auVar89._8_4_ = 0x3f800003;
  auVar89._0_8_ = 0x3f8000033f800003;
  auVar89._12_4_ = 0x3f800003;
  auVar86 = vmulps_avx512vl(auVar86,auVar89);
  uVar139 = vcmpps_avx512vl(local_270,auVar86,2);
  uVar22 = vpcmpgtd_avx512vl(auVar68,_DAT_01f4ad30);
  local_530 = ray;
  for (uVar63 = CONCAT44((int)((ulong)unaff_R13 >> 0x20),(uint)((byte)uVar139 & 0xf & (byte)uVar22))
      ; uVar63 != 0; uVar63 = (ulong)((uint)uVar63 & (uint)uVar63 + 0xf & (uint)uVar139)) {
    lVar61 = 0;
    for (uVar58 = uVar63; (uVar58 & 1) == 0; uVar58 = uVar58 >> 1 | 0x8000000000000000) {
      lVar61 = lVar61 + 1;
    }
    local_528 = (ulong)*(uint *)(local_368 + 2);
    pGVar10 = (local_540->scene->geometries).items[*(uint *)(local_368 + 2)].ptr;
    local_4a8 = (ulong)*(uint *)(local_368 + lVar61 * 4 + 6);
    uVar58 = (ulong)*(uint *)(*(long *)&pGVar10->field_0x58 +
                             (ulong)*(uint *)(local_368 + lVar61 * 4 + 6) *
                             pGVar10[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>
                             ._M_i);
    fVar164 = (pGVar10->time_range).lower;
    fVar164 = pGVar10->fnumTimeSegments *
              (((ray->dir).field_0.m128[3] - fVar164) / ((pGVar10->time_range).upper - fVar164));
    auVar86 = vroundss_avx(ZEXT416((uint)fVar164),ZEXT416((uint)fVar164),9);
    auVar86 = vminss_avx(auVar86,ZEXT416((uint)(pGVar10->fnumTimeSegments + -1.0)));
    auVar86 = vmaxss_avx(ZEXT816(0) << 0x20,auVar86);
    fVar164 = fVar164 - auVar86._0_4_;
    _Var11 = pGVar10[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    lVar60 = (long)(int)auVar86._0_4_ * 0x38;
    lVar61 = *(long *)(_Var11 + 0x10 + lVar60);
    lVar62 = *(long *)(_Var11 + 0x38 + lVar60);
    lVar12 = *(long *)(_Var11 + 0x48 + lVar60);
    auVar68._4_4_ = fVar164;
    auVar68._0_4_ = fVar164;
    auVar68._8_4_ = fVar164;
    auVar68._12_4_ = fVar164;
    pfVar4 = (float *)(lVar62 + uVar58 * lVar12);
    auVar181._0_4_ = fVar164 * *pfVar4;
    auVar181._4_4_ = fVar164 * pfVar4[1];
    auVar181._8_4_ = fVar164 * pfVar4[2];
    auVar181._12_4_ = fVar164 * pfVar4[3];
    pfVar4 = (float *)(lVar62 + (uVar58 + 1) * lVar12);
    auVar183._0_4_ = fVar164 * *pfVar4;
    auVar183._4_4_ = fVar164 * pfVar4[1];
    auVar183._8_4_ = fVar164 * pfVar4[2];
    auVar183._12_4_ = fVar164 * pfVar4[3];
    auVar86 = vmulps_avx512vl(auVar68,*(undefined1 (*) [16])(lVar62 + (uVar58 + 2) * lVar12));
    auVar85 = vmulps_avx512vl(auVar68,*(undefined1 (*) [16])(lVar62 + lVar12 * (uVar58 + 3)));
    lVar62 = *(long *)(_Var11 + lVar60);
    auVar87 = vsubss_avx512f(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)fVar164));
    auVar71._0_4_ = auVar87._0_4_;
    auVar71._4_4_ = auVar71._0_4_;
    auVar71._8_4_ = auVar71._0_4_;
    auVar71._12_4_ = auVar71._0_4_;
    local_3d0 = vfmadd231ps_fma(auVar181,auVar71,*(undefined1 (*) [16])(lVar62 + lVar61 * uVar58));
    local_3e0 = vfmadd231ps_fma(auVar183,auVar71,
                                *(undefined1 (*) [16])(lVar62 + lVar61 * (uVar58 + 1)));
    local_3f0 = vfmadd231ps_avx512vl
                          (auVar86,auVar71,*(undefined1 (*) [16])(lVar62 + lVar61 * (uVar58 + 2)));
    _local_310 = vfmadd231ps_avx512vl
                           (auVar85,auVar71,*(undefined1 (*) [16])(lVar62 + lVar61 * (uVar58 + 3)));
    iVar9 = (int)pGVar10[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    aVar5 = (local_530->org).field_0;
    auVar85 = vsubps_avx(local_3d0,(undefined1  [16])aVar5);
    uVar136 = auVar85._0_4_;
    auVar141._4_4_ = uVar136;
    auVar141._0_4_ = uVar136;
    auVar141._8_4_ = uVar136;
    auVar141._12_4_ = uVar136;
    auVar86 = vshufps_avx(auVar85,auVar85,0x55);
    aVar6 = (local_520->ray_space).vx.field_0;
    aVar7 = (local_520->ray_space).vy.field_0;
    fVar164 = (local_520->ray_space).vz.field_0.m128[0];
    fVar146 = (local_520->ray_space).vz.field_0.m128[1];
    fVar169 = (local_520->ray_space).vz.field_0.m128[2];
    fVar170 = (local_520->ray_space).vz.field_0.m128[3];
    auVar85 = vshufps_avx(auVar85,auVar85,0xaa);
    auVar168._0_4_ = auVar85._0_4_ * fVar164;
    auVar168._4_4_ = auVar85._4_4_ * fVar146;
    auVar168._8_4_ = auVar85._8_4_ * fVar169;
    auVar168._12_4_ = auVar85._12_4_ * fVar170;
    auVar86 = vfmadd231ps_fma(auVar168,(undefined1  [16])aVar7,auVar86);
    auVar87 = vfmadd231ps_fma(auVar86,(undefined1  [16])aVar6,auVar141);
    auVar85 = vsubps_avx(local_3e0,(undefined1  [16])aVar5);
    uVar136 = auVar85._0_4_;
    auVar142._4_4_ = uVar136;
    auVar142._0_4_ = uVar136;
    auVar142._8_4_ = uVar136;
    auVar142._12_4_ = uVar136;
    auVar86 = vshufps_avx(auVar85,auVar85,0x55);
    auVar85 = vshufps_avx(auVar85,auVar85,0xaa);
    auVar174._0_4_ = auVar85._0_4_ * fVar164;
    auVar174._4_4_ = auVar85._4_4_ * fVar146;
    auVar174._8_4_ = auVar85._8_4_ * fVar169;
    auVar174._12_4_ = auVar85._12_4_ * fVar170;
    auVar86 = vfmadd231ps_fma(auVar174,(undefined1  [16])aVar7,auVar86);
    auVar80 = vfmadd231ps_fma(auVar86,(undefined1  [16])aVar6,auVar142);
    auVar85 = vsubps_avx512vl(local_3f0,(undefined1  [16])aVar5);
    uVar136 = auVar85._0_4_;
    auVar143._4_4_ = uVar136;
    auVar143._0_4_ = uVar136;
    auVar143._8_4_ = uVar136;
    auVar143._12_4_ = uVar136;
    auVar86 = vshufps_avx(auVar85,auVar85,0x55);
    auVar85 = vshufps_avx(auVar85,auVar85,0xaa);
    auVar177._0_4_ = auVar85._0_4_ * fVar164;
    auVar177._4_4_ = auVar85._4_4_ * fVar146;
    auVar177._8_4_ = auVar85._8_4_ * fVar169;
    auVar177._12_4_ = auVar85._12_4_ * fVar170;
    auVar86 = vfmadd231ps_fma(auVar177,(undefined1  [16])aVar7,auVar86);
    auVar8 = vfmadd231ps_fma(auVar86,(undefined1  [16])aVar6,auVar143);
    local_2e0 = ZEXT1632((undefined1  [16])aVar5);
    auVar85 = vsubps_avx512vl(_local_310,(undefined1  [16])aVar5);
    uVar136 = auVar85._0_4_;
    auVar144._4_4_ = uVar136;
    auVar144._0_4_ = uVar136;
    auVar144._8_4_ = uVar136;
    auVar144._12_4_ = uVar136;
    auVar86 = vshufps_avx(auVar85,auVar85,0x55);
    auVar85 = vshufps_avx(auVar85,auVar85,0xaa);
    auVar179._0_4_ = auVar85._0_4_ * fVar164;
    auVar179._4_4_ = auVar85._4_4_ * fVar146;
    auVar179._8_4_ = auVar85._8_4_ * fVar169;
    auVar179._12_4_ = auVar85._12_4_ * fVar170;
    auVar86 = vfmadd231ps_fma(auVar179,(undefined1  [16])aVar7,auVar86);
    auVar77 = vfmadd231ps_fma(auVar86,(undefined1  [16])aVar6,auVar144);
    local_538 = (long)iVar9;
    lVar61 = local_538 * 0x44;
    auVar105 = *(undefined1 (*) [32])(bezier_basis0 + lVar61);
    local_340 = vbroadcastss_avx512vl(auVar87);
    auVar90._8_4_ = 1;
    auVar90._0_8_ = 0x100000001;
    auVar90._12_4_ = 1;
    auVar90._16_4_ = 1;
    auVar90._20_4_ = 1;
    auVar90._24_4_ = 1;
    auVar90._28_4_ = 1;
    local_360 = vpermps_avx2(auVar90,ZEXT1632(auVar87));
    auVar106 = *(undefined1 (*) [32])(bezier_basis0 + lVar61 + 0x484);
    uVar136 = auVar80._0_4_;
    local_420._4_4_ = uVar136;
    local_420._0_4_ = uVar136;
    local_420._8_4_ = uVar136;
    local_420._12_4_ = uVar136;
    local_420._16_4_ = uVar136;
    local_420._20_4_ = uVar136;
    local_420._24_4_ = uVar136;
    local_420._28_4_ = uVar136;
    auVar104 = *(undefined1 (*) [32])(bezier_basis0 + lVar61 + 0x908);
    local_4a0 = vpermps_avx2(auVar90,ZEXT1632(auVar80));
    local_440 = vbroadcastss_avx512vl(auVar8);
    local_460 = vpermps_avx512vl(auVar90,ZEXT1632(auVar8));
    auVar103 = *(undefined1 (*) [32])(bezier_basis0 + lVar61 + 0xd8c);
    fVar164 = auVar77._0_4_;
    local_3c0._4_4_ = fVar164;
    local_3c0._0_4_ = fVar164;
    local_3c0._8_4_ = fVar164;
    local_3c0._12_4_ = fVar164;
    local_3c0._16_4_ = fVar164;
    local_3c0._20_4_ = fVar164;
    local_3c0._24_4_ = fVar164;
    local_3c0._28_4_ = fVar164;
    local_480 = vpermps_avx512vl(auVar90,ZEXT1632(auVar77));
    auVar90 = vmulps_avx512vl(local_3c0,auVar103);
    auVar91 = vmulps_avx512vl(local_480,auVar103);
    auVar90 = vfmadd231ps_avx512vl(auVar90,auVar104,local_440);
    auVar91 = vfmadd231ps_avx512vl(auVar91,auVar104,local_460);
    auVar86 = vfmadd231ps_fma(auVar90,auVar106,local_420);
    auVar85 = vfmadd231ps_fma(auVar91,auVar106,local_4a0);
    auVar92 = vfmadd231ps_avx512vl(ZEXT1632(auVar86),auVar105,local_340);
    auVar90 = *(undefined1 (*) [32])(bezier_basis1 + lVar61);
    auVar91 = *(undefined1 (*) [32])(bezier_basis1 + lVar61 + 0x484);
    auVar93 = vfmadd231ps_avx512vl(ZEXT1632(auVar85),auVar105,local_360);
    auVar102 = *(undefined1 (*) [32])(bezier_basis1 + lVar61 + 0x908);
    auVar101 = *(undefined1 (*) [32])(bezier_basis1 + lVar61 + 0xd8c);
    auVar94 = vmulps_avx512vl(local_3c0,auVar101);
    auVar95 = vmulps_avx512vl(local_480,auVar101);
    auVar94 = vfmadd231ps_avx512vl(auVar94,auVar102,local_440);
    auVar95 = vfmadd231ps_avx512vl(auVar95,auVar102,local_460);
    auVar94 = vfmadd231ps_avx512vl(auVar94,auVar91,local_420);
    auVar95 = vfmadd231ps_avx512vl(auVar95,auVar91,local_4a0);
    auVar94 = vfmadd231ps_avx512vl(auVar94,auVar90,local_340);
    auVar76 = vfmadd231ps_fma(auVar95,auVar90,local_360);
    auVar95 = vsubps_avx512vl(auVar94,auVar92);
    auVar96 = vsubps_avx512vl(ZEXT1632(auVar76),auVar93);
    auVar97 = vmulps_avx512vl(auVar93,auVar95);
    auVar98 = vmulps_avx512vl(auVar92,auVar96);
    auVar97 = vsubps_avx512vl(auVar97,auVar98);
    auVar86 = vshufps_avx(local_3d0,local_3d0,0xff);
    uVar139 = auVar86._0_8_;
    local_80._8_8_ = uVar139;
    local_80._0_8_ = uVar139;
    local_80._16_8_ = uVar139;
    local_80._24_8_ = uVar139;
    auVar86 = vshufps_avx(local_3e0,local_3e0,0xff);
    local_a0 = vbroadcastsd_avx512vl(auVar86);
    auVar86 = vshufps_avx512vl(local_3f0,local_3f0,0xff);
    local_c0 = vbroadcastsd_avx512vl(auVar86);
    auVar86 = vshufps_avx512vl(_local_310,_local_310,0xff);
    uVar139 = auVar86._0_8_;
    register0x000012c8 = uVar139;
    local_e0 = uVar139;
    register0x000012d0 = uVar139;
    register0x000012d8 = uVar139;
    auVar98 = vmulps_avx512vl(_local_e0,auVar103);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar104,local_c0);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar106,local_a0);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar105,local_80);
    auVar99 = vmulps_avx512vl(_local_e0,auVar101);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar102,local_c0);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar91,local_a0);
    auVar73 = vfmadd231ps_fma(auVar99,auVar90,local_80);
    auVar99 = vmulps_avx512vl(auVar96,auVar96);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar95,auVar95);
    auVar100 = vmaxps_avx512vl(auVar98,ZEXT1632(auVar73));
    auVar100 = vmulps_avx512vl(auVar100,auVar100);
    auVar99 = vmulps_avx512vl(auVar100,auVar99);
    auVar97 = vmulps_avx512vl(auVar97,auVar97);
    uVar139 = vcmpps_avx512vl(auVar97,auVar99,2);
    auVar78 = local_3d0;
    auVar86 = vblendps_avx(auVar87,local_3d0,8);
    auVar79 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar85 = vandps_avx512vl(auVar86,auVar79);
    auVar75 = local_3e0;
    auVar86 = vblendps_avx(auVar80,local_3e0,8);
    auVar86 = vandps_avx512vl(auVar86,auVar79);
    auVar85 = vmaxps_avx(auVar85,auVar86);
    auVar74 = local_3f0;
    auVar86 = vblendps_avx(auVar8,local_3f0,8);
    auVar88 = vandps_avx512vl(auVar86,auVar79);
    auVar86 = vblendps_avx(auVar77,_local_310,8);
    auVar86 = vandps_avx512vl(auVar86,auVar79);
    auVar86 = vmaxps_avx(auVar88,auVar86);
    auVar86 = vmaxps_avx(auVar85,auVar86);
    auVar85 = vmovshdup_avx(auVar86);
    auVar85 = vmaxss_avx(auVar85,auVar86);
    auVar86 = vshufpd_avx(auVar86,auVar86,1);
    auVar86 = vmaxss_avx(auVar86,auVar85);
    _local_300 = vcvtsi2ss_avx512f(local_3f0,iVar9);
    auVar99._0_4_ = local_300._0_4_;
    auVar99._4_4_ = auVar99._0_4_;
    auVar99._8_4_ = auVar99._0_4_;
    auVar99._12_4_ = auVar99._0_4_;
    auVar99._16_4_ = auVar99._0_4_;
    auVar99._20_4_ = auVar99._0_4_;
    auVar99._24_4_ = auVar99._0_4_;
    auVar99._28_4_ = auVar99._0_4_;
    uVar22 = vcmpps_avx512vl(auVar99,_DAT_01f7b060,0xe);
    bVar65 = (byte)uVar139 & (byte)uVar22;
    local_2c0 = auVar86._0_4_ * 4.7683716e-07;
    auVar97._8_4_ = 2;
    auVar97._0_8_ = 0x200000002;
    auVar97._12_4_ = 2;
    auVar97._16_4_ = 2;
    auVar97._20_4_ = 2;
    auVar97._24_4_ = 2;
    auVar97._28_4_ = 2;
    local_100 = vpermps_avx512vl(auVar97,ZEXT1632(auVar87));
    local_120 = vpermps_avx512vl(auVar97,ZEXT1632(auVar80));
    local_140 = vpermps_avx512vl(auVar97,ZEXT1632(auVar8));
    local_3a0 = vpermps_avx2(auVar97,ZEXT1632(auVar77));
    auVar86 = local_100._0_16_;
    if (bVar65 == 0) {
      bVar64 = false;
      auVar105 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar190 = ZEXT3264(auVar105);
      auVar86 = vxorps_avx512vl(auVar86,auVar86);
      auVar191 = ZEXT1664(auVar86);
      auVar192 = ZEXT3264(local_340);
      auVar193 = ZEXT3264(local_360);
      auVar189 = ZEXT3264(local_420);
      auVar195 = ZEXT3264(local_4a0);
      auVar196 = ZEXT3264(local_440);
      auVar197 = ZEXT3264(local_460);
      auVar188 = ZEXT3264(local_3c0);
      auVar194 = ZEXT3264(local_480);
      local_3f0 = auVar74;
      local_3e0 = auVar75;
      local_3d0 = auVar78;
    }
    else {
      auVar101 = vmulps_avx512vl(local_3a0,auVar101);
      auVar102 = vfmadd213ps_avx512vl(auVar102,local_140,auVar101);
      auVar91 = vfmadd213ps_avx512vl(auVar91,local_120,auVar102);
      auVar97 = vfmadd213ps_avx512vl(auVar90,local_100,auVar91);
      auVar103 = vmulps_avx512vl(local_3a0,auVar103);
      auVar104 = vfmadd213ps_avx512vl(auVar104,local_140,auVar103);
      auVar91 = vfmadd213ps_avx512vl(auVar106,local_120,auVar104);
      auVar106 = *(undefined1 (*) [32])(bezier_basis0 + lVar61 + 0x1210);
      auVar104 = *(undefined1 (*) [32])(bezier_basis0 + lVar61 + 0x1694);
      auVar103 = *(undefined1 (*) [32])(bezier_basis0 + lVar61 + 0x1b18);
      auVar90 = *(undefined1 (*) [32])(bezier_basis0 + lVar61 + 0x1f9c);
      auVar100 = vfmadd213ps_avx512vl(auVar105,local_100,auVar91);
      auVar105 = vmulps_avx512vl(local_3c0,auVar90);
      auVar91 = vmulps_avx512vl(local_480,auVar90);
      auVar90 = vmulps_avx512vl(local_3a0,auVar90);
      auVar105 = vfmadd231ps_avx512vl(auVar105,auVar103,local_440);
      auVar197 = ZEXT3264(local_460);
      auVar91 = vfmadd231ps_avx512vl(auVar91,auVar103,local_460);
      auVar103 = vfmadd231ps_avx512vl(auVar90,local_140,auVar103);
      auVar189 = ZEXT3264(local_420);
      auVar105 = vfmadd231ps_avx512vl(auVar105,auVar104,local_420);
      auVar90 = vfmadd231ps_avx512vl(auVar91,auVar104,local_4a0);
      auVar91 = vfmadd231ps_avx512vl(auVar103,local_120,auVar104);
      auVar85 = vfmadd231ps_fma(auVar105,auVar106,local_340);
      auVar90 = vfmadd231ps_avx512vl(auVar90,auVar106,local_360);
      auVar105 = *(undefined1 (*) [32])(bezier_basis1 + lVar61 + 0x1210);
      auVar104 = *(undefined1 (*) [32])(bezier_basis1 + lVar61 + 0x1b18);
      auVar103 = *(undefined1 (*) [32])(bezier_basis1 + lVar61 + 0x1f9c);
      auVar102 = vfmadd231ps_avx512vl(auVar91,local_100,auVar106);
      auVar91._4_4_ = fVar164 * auVar103._4_4_;
      auVar91._0_4_ = fVar164 * auVar103._0_4_;
      auVar91._8_4_ = fVar164 * auVar103._8_4_;
      auVar91._12_4_ = fVar164 * auVar103._12_4_;
      auVar91._16_4_ = fVar164 * auVar103._16_4_;
      auVar91._20_4_ = fVar164 * auVar103._20_4_;
      auVar91._24_4_ = fVar164 * auVar103._24_4_;
      auVar91._28_4_ = auVar106._28_4_;
      auVar106 = vmulps_avx512vl(local_480,auVar103);
      auVar103 = vmulps_avx512vl(local_3a0,auVar103);
      auVar91 = vfmadd231ps_avx512vl(auVar91,auVar104,local_440);
      auVar101 = vfmadd231ps_avx512vl(auVar106,auVar104,local_460);
      auVar104 = vfmadd231ps_avx512vl(auVar103,local_140,auVar104);
      auVar106 = *(undefined1 (*) [32])(bezier_basis1 + lVar61 + 0x1694);
      auVar103 = vfmadd231ps_avx512vl(auVar91,auVar106,local_420);
      auVar91 = vfmadd231ps_avx512vl(auVar101,auVar106,local_4a0);
      auVar106 = vfmadd231ps_avx512vl(auVar104,local_120,auVar106);
      auVar87 = vfmadd231ps_fma(auVar103,auVar105,local_340);
      auVar192 = ZEXT3264(local_340);
      auVar104 = vfmadd231ps_avx512vl(auVar91,auVar105,local_360);
      auVar103 = vfmadd231ps_avx512vl(auVar106,local_100,auVar105);
      auVar186._8_4_ = 0x7fffffff;
      auVar186._0_8_ = 0x7fffffff7fffffff;
      auVar186._12_4_ = 0x7fffffff;
      auVar186._16_4_ = 0x7fffffff;
      auVar186._20_4_ = 0x7fffffff;
      auVar186._24_4_ = 0x7fffffff;
      auVar186._28_4_ = 0x7fffffff;
      auVar105 = vandps_avx(ZEXT1632(auVar85),auVar186);
      auVar106 = vandps_avx(auVar90,auVar186);
      auVar106 = vmaxps_avx(auVar105,auVar106);
      auVar105 = vandps_avx(auVar102,auVar186);
      auVar105 = vmaxps_avx(auVar106,auVar105);
      auVar91 = vbroadcastss_avx512vl(ZEXT416((uint)local_2c0));
      uVar58 = vcmpps_avx512vl(auVar105,auVar91,1);
      bVar64 = (bool)((byte)uVar58 & 1);
      auVar107._0_4_ = (float)((uint)bVar64 * auVar95._0_4_ | (uint)!bVar64 * auVar85._0_4_);
      bVar64 = (bool)((byte)(uVar58 >> 1) & 1);
      auVar107._4_4_ = (float)((uint)bVar64 * auVar95._4_4_ | (uint)!bVar64 * auVar85._4_4_);
      bVar64 = (bool)((byte)(uVar58 >> 2) & 1);
      auVar107._8_4_ = (float)((uint)bVar64 * auVar95._8_4_ | (uint)!bVar64 * auVar85._8_4_);
      bVar64 = (bool)((byte)(uVar58 >> 3) & 1);
      auVar107._12_4_ = (float)((uint)bVar64 * auVar95._12_4_ | (uint)!bVar64 * auVar85._12_4_);
      fVar146 = (float)((uint)((byte)(uVar58 >> 4) & 1) * auVar95._16_4_);
      auVar107._16_4_ = fVar146;
      fVar164 = (float)((uint)((byte)(uVar58 >> 5) & 1) * auVar95._20_4_);
      auVar107._20_4_ = fVar164;
      fVar169 = (float)((uint)((byte)(uVar58 >> 6) & 1) * auVar95._24_4_);
      auVar107._24_4_ = fVar169;
      uVar1 = (uint)(byte)(uVar58 >> 7) * auVar95._28_4_;
      auVar107._28_4_ = uVar1;
      bVar64 = (bool)((byte)uVar58 & 1);
      auVar108._0_4_ = (float)((uint)bVar64 * auVar96._0_4_ | (uint)!bVar64 * auVar90._0_4_);
      bVar64 = (bool)((byte)(uVar58 >> 1) & 1);
      auVar108._4_4_ = (float)((uint)bVar64 * auVar96._4_4_ | (uint)!bVar64 * auVar90._4_4_);
      bVar64 = (bool)((byte)(uVar58 >> 2) & 1);
      auVar108._8_4_ = (float)((uint)bVar64 * auVar96._8_4_ | (uint)!bVar64 * auVar90._8_4_);
      bVar64 = (bool)((byte)(uVar58 >> 3) & 1);
      auVar108._12_4_ = (float)((uint)bVar64 * auVar96._12_4_ | (uint)!bVar64 * auVar90._12_4_);
      bVar64 = (bool)((byte)(uVar58 >> 4) & 1);
      auVar108._16_4_ = (float)((uint)bVar64 * auVar96._16_4_ | (uint)!bVar64 * auVar90._16_4_);
      bVar64 = (bool)((byte)(uVar58 >> 5) & 1);
      auVar108._20_4_ = (float)((uint)bVar64 * auVar96._20_4_ | (uint)!bVar64 * auVar90._20_4_);
      bVar64 = (bool)((byte)(uVar58 >> 6) & 1);
      auVar108._24_4_ = (float)((uint)bVar64 * auVar96._24_4_ | (uint)!bVar64 * auVar90._24_4_);
      bVar64 = SUB81(uVar58 >> 7,0);
      auVar108._28_4_ = (uint)bVar64 * auVar96._28_4_ | (uint)!bVar64 * auVar90._28_4_;
      auVar105 = vandps_avx(auVar186,ZEXT1632(auVar87));
      auVar106 = vandps_avx(auVar104,auVar186);
      auVar106 = vmaxps_avx(auVar105,auVar106);
      auVar105 = vandps_avx(auVar103,auVar186);
      auVar105 = vmaxps_avx(auVar106,auVar105);
      uVar58 = vcmpps_avx512vl(auVar105,auVar91,1);
      bVar64 = (bool)((byte)uVar58 & 1);
      auVar109._0_4_ = (float)((uint)bVar64 * auVar95._0_4_ | (uint)!bVar64 * auVar87._0_4_);
      bVar64 = (bool)((byte)(uVar58 >> 1) & 1);
      auVar109._4_4_ = (float)((uint)bVar64 * auVar95._4_4_ | (uint)!bVar64 * auVar87._4_4_);
      bVar64 = (bool)((byte)(uVar58 >> 2) & 1);
      auVar109._8_4_ = (float)((uint)bVar64 * auVar95._8_4_ | (uint)!bVar64 * auVar87._8_4_);
      bVar64 = (bool)((byte)(uVar58 >> 3) & 1);
      auVar109._12_4_ = (float)((uint)bVar64 * auVar95._12_4_ | (uint)!bVar64 * auVar87._12_4_);
      fVar170 = (float)((uint)((byte)(uVar58 >> 4) & 1) * auVar95._16_4_);
      auVar109._16_4_ = fVar170;
      fVar171 = (float)((uint)((byte)(uVar58 >> 5) & 1) * auVar95._20_4_);
      auVar109._20_4_ = fVar171;
      fVar165 = (float)((uint)((byte)(uVar58 >> 6) & 1) * auVar95._24_4_);
      auVar109._24_4_ = fVar165;
      auVar109._28_4_ = (uint)(byte)(uVar58 >> 7) * auVar95._28_4_;
      bVar64 = (bool)((byte)uVar58 & 1);
      auVar110._0_4_ = (float)((uint)bVar64 * auVar96._0_4_ | (uint)!bVar64 * auVar104._0_4_);
      bVar64 = (bool)((byte)(uVar58 >> 1) & 1);
      auVar110._4_4_ = (float)((uint)bVar64 * auVar96._4_4_ | (uint)!bVar64 * auVar104._4_4_);
      bVar64 = (bool)((byte)(uVar58 >> 2) & 1);
      auVar110._8_4_ = (float)((uint)bVar64 * auVar96._8_4_ | (uint)!bVar64 * auVar104._8_4_);
      bVar64 = (bool)((byte)(uVar58 >> 3) & 1);
      auVar110._12_4_ = (float)((uint)bVar64 * auVar96._12_4_ | (uint)!bVar64 * auVar104._12_4_);
      bVar64 = (bool)((byte)(uVar58 >> 4) & 1);
      auVar110._16_4_ = (float)((uint)bVar64 * auVar96._16_4_ | (uint)!bVar64 * auVar104._16_4_);
      bVar64 = (bool)((byte)(uVar58 >> 5) & 1);
      auVar110._20_4_ = (float)((uint)bVar64 * auVar96._20_4_ | (uint)!bVar64 * auVar104._20_4_);
      bVar64 = (bool)((byte)(uVar58 >> 6) & 1);
      auVar110._24_4_ = (float)((uint)bVar64 * auVar96._24_4_ | (uint)!bVar64 * auVar104._24_4_);
      bVar64 = SUB81(uVar58 >> 7,0);
      auVar110._28_4_ = (uint)bVar64 * auVar96._28_4_ | (uint)!bVar64 * auVar104._28_4_;
      auVar89 = vxorps_avx512vl(auVar86,auVar86);
      auVar191 = ZEXT1664(auVar89);
      auVar105 = vfmadd213ps_avx512vl(auVar107,auVar107,ZEXT1632(auVar89));
      auVar86 = vfmadd231ps_fma(auVar105,auVar108,auVar108);
      auVar104 = vrsqrt14ps_avx512vl(ZEXT1632(auVar86));
      fVar66 = auVar104._0_4_;
      fVar67 = auVar104._4_4_;
      fVar127 = auVar104._8_4_;
      fVar128 = auVar104._12_4_;
      fVar129 = auVar104._16_4_;
      fVar130 = auVar104._20_4_;
      fVar132 = auVar104._24_4_;
      auVar105._4_4_ = fVar67 * fVar67 * fVar67 * auVar86._4_4_ * -0.5;
      auVar105._0_4_ = fVar66 * fVar66 * fVar66 * auVar86._0_4_ * -0.5;
      auVar105._8_4_ = fVar127 * fVar127 * fVar127 * auVar86._8_4_ * -0.5;
      auVar105._12_4_ = fVar128 * fVar128 * fVar128 * auVar86._12_4_ * -0.5;
      auVar105._16_4_ = fVar129 * fVar129 * fVar129 * -0.0;
      auVar105._20_4_ = fVar130 * fVar130 * fVar130 * -0.0;
      auVar105._24_4_ = fVar132 * fVar132 * fVar132 * -0.0;
      auVar105._28_4_ = 0;
      auVar90 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
      auVar105 = vfmadd231ps_avx512vl(auVar105,auVar90,auVar104);
      auVar106._4_4_ = auVar108._4_4_ * auVar105._4_4_;
      auVar106._0_4_ = auVar108._0_4_ * auVar105._0_4_;
      auVar106._8_4_ = auVar108._8_4_ * auVar105._8_4_;
      auVar106._12_4_ = auVar108._12_4_ * auVar105._12_4_;
      auVar106._16_4_ = auVar108._16_4_ * auVar105._16_4_;
      auVar106._20_4_ = auVar108._20_4_ * auVar105._20_4_;
      auVar106._24_4_ = auVar108._24_4_ * auVar105._24_4_;
      auVar106._28_4_ = auVar104._28_4_;
      auVar104._4_4_ = auVar105._4_4_ * -auVar107._4_4_;
      auVar104._0_4_ = auVar105._0_4_ * -auVar107._0_4_;
      auVar104._8_4_ = auVar105._8_4_ * -auVar107._8_4_;
      auVar104._12_4_ = auVar105._12_4_ * -auVar107._12_4_;
      auVar104._16_4_ = auVar105._16_4_ * -fVar146;
      auVar104._20_4_ = auVar105._20_4_ * -fVar164;
      auVar104._24_4_ = auVar105._24_4_ * -fVar169;
      auVar104._28_4_ = uVar1 ^ 0x80000000;
      auVar91 = vmulps_avx512vl(auVar105,ZEXT1632(auVar89));
      auVar95 = ZEXT1632(auVar89);
      auVar103 = vfmadd213ps_avx512vl(auVar109,auVar109,auVar95);
      auVar86 = vfmadd231ps_fma(auVar103,auVar110,auVar110);
      auVar101 = vrsqrt14ps_avx512vl(ZEXT1632(auVar86));
      fVar164 = auVar101._0_4_;
      fVar146 = auVar101._4_4_;
      fVar169 = auVar101._8_4_;
      fVar66 = auVar101._12_4_;
      fVar67 = auVar101._16_4_;
      fVar127 = auVar101._20_4_;
      fVar128 = auVar101._24_4_;
      auVar103._4_4_ = fVar146 * fVar146 * fVar146 * auVar86._4_4_ * -0.5;
      auVar103._0_4_ = fVar164 * fVar164 * fVar164 * auVar86._0_4_ * -0.5;
      auVar103._8_4_ = fVar169 * fVar169 * fVar169 * auVar86._8_4_ * -0.5;
      auVar103._12_4_ = fVar66 * fVar66 * fVar66 * auVar86._12_4_ * -0.5;
      auVar103._16_4_ = fVar67 * fVar67 * fVar67 * -0.0;
      auVar103._20_4_ = fVar127 * fVar127 * fVar127 * -0.0;
      auVar103._24_4_ = fVar128 * fVar128 * fVar128 * -0.0;
      auVar103._28_4_ = 0;
      auVar103 = vfmadd231ps_avx512vl(auVar103,auVar90,auVar101);
      auVar102._4_4_ = auVar110._4_4_ * auVar103._4_4_;
      auVar102._0_4_ = auVar110._0_4_ * auVar103._0_4_;
      auVar102._8_4_ = auVar110._8_4_ * auVar103._8_4_;
      auVar102._12_4_ = auVar110._12_4_ * auVar103._12_4_;
      auVar102._16_4_ = auVar110._16_4_ * auVar103._16_4_;
      auVar102._20_4_ = auVar110._20_4_ * auVar103._20_4_;
      auVar102._24_4_ = auVar110._24_4_ * auVar103._24_4_;
      auVar102._28_4_ = auVar101._28_4_;
      auVar101._4_4_ = -auVar109._4_4_ * auVar103._4_4_;
      auVar101._0_4_ = -auVar109._0_4_ * auVar103._0_4_;
      auVar101._8_4_ = -auVar109._8_4_ * auVar103._8_4_;
      auVar101._12_4_ = -auVar109._12_4_ * auVar103._12_4_;
      auVar101._16_4_ = -fVar170 * auVar103._16_4_;
      auVar101._20_4_ = -fVar171 * auVar103._20_4_;
      auVar101._24_4_ = -fVar165 * auVar103._24_4_;
      auVar101._28_4_ = auVar105._28_4_;
      auVar105 = vmulps_avx512vl(auVar103,auVar95);
      auVar86 = vfmadd213ps_fma(auVar106,auVar98,auVar92);
      auVar85 = vfmadd213ps_fma(auVar104,auVar98,auVar93);
      auVar103 = vfmadd213ps_avx512vl(auVar91,auVar98,auVar100);
      auVar90 = vfmadd213ps_avx512vl(auVar102,ZEXT1632(auVar73),auVar94);
      auVar79 = vfnmadd213ps_fma(auVar106,auVar98,auVar92);
      auVar92 = ZEXT1632(auVar73);
      auVar87 = vfmadd213ps_fma(auVar101,auVar92,ZEXT1632(auVar76));
      auVar88 = vfnmadd213ps_fma(auVar104,auVar98,auVar93);
      auVar80 = vfmadd213ps_fma(auVar105,auVar92,auVar97);
      auVar106 = vfnmadd231ps_avx512vl(auVar100,auVar98,auVar91);
      auVar20 = vfnmadd213ps_fma(auVar102,auVar92,auVar94);
      auVar76 = vfnmadd213ps_fma(auVar101,auVar92,ZEXT1632(auVar76));
      auVar21 = vfnmadd231ps_fma(auVar97,ZEXT1632(auVar73),auVar105);
      auVar104 = vsubps_avx512vl(auVar90,ZEXT1632(auVar79));
      auVar105 = vsubps_avx(ZEXT1632(auVar87),ZEXT1632(auVar88));
      auVar91 = vsubps_avx512vl(ZEXT1632(auVar80),auVar106);
      auVar102 = vmulps_avx512vl(auVar105,auVar106);
      auVar8 = vfmsub231ps_fma(auVar102,ZEXT1632(auVar88),auVar91);
      auVar92._4_4_ = auVar79._4_4_ * auVar91._4_4_;
      auVar92._0_4_ = auVar79._0_4_ * auVar91._0_4_;
      auVar92._8_4_ = auVar79._8_4_ * auVar91._8_4_;
      auVar92._12_4_ = auVar79._12_4_ * auVar91._12_4_;
      auVar92._16_4_ = auVar91._16_4_ * 0.0;
      auVar92._20_4_ = auVar91._20_4_ * 0.0;
      auVar92._24_4_ = auVar91._24_4_ * 0.0;
      auVar92._28_4_ = auVar91._28_4_;
      auVar91 = vfmsub231ps_avx512vl(auVar92,auVar106,auVar104);
      auVar93._4_4_ = auVar88._4_4_ * auVar104._4_4_;
      auVar93._0_4_ = auVar88._0_4_ * auVar104._0_4_;
      auVar93._8_4_ = auVar88._8_4_ * auVar104._8_4_;
      auVar93._12_4_ = auVar88._12_4_ * auVar104._12_4_;
      auVar93._16_4_ = auVar104._16_4_ * 0.0;
      auVar93._20_4_ = auVar104._20_4_ * 0.0;
      auVar93._24_4_ = auVar104._24_4_ * 0.0;
      auVar93._28_4_ = auVar104._28_4_;
      auVar77 = vfmsub231ps_fma(auVar93,ZEXT1632(auVar79),auVar105);
      auVar105 = vfmadd231ps_avx512vl(ZEXT1632(auVar77),auVar95,auVar91);
      auVar105 = vfmadd231ps_avx512vl(auVar105,auVar95,ZEXT1632(auVar8));
      auVar97 = ZEXT1632(auVar89);
      uVar58 = vcmpps_avx512vl(auVar105,auVar97,2);
      bVar57 = (byte)uVar58;
      fVar66 = (float)((uint)(bVar57 & 1) * auVar86._0_4_ |
                      (uint)!(bool)(bVar57 & 1) * auVar20._0_4_);
      bVar64 = (bool)((byte)(uVar58 >> 1) & 1);
      fVar127 = (float)((uint)bVar64 * auVar86._4_4_ | (uint)!bVar64 * auVar20._4_4_);
      bVar64 = (bool)((byte)(uVar58 >> 2) & 1);
      fVar129 = (float)((uint)bVar64 * auVar86._8_4_ | (uint)!bVar64 * auVar20._8_4_);
      bVar64 = (bool)((byte)(uVar58 >> 3) & 1);
      fVar132 = (float)((uint)bVar64 * auVar86._12_4_ | (uint)!bVar64 * auVar20._12_4_);
      auVar102 = ZEXT1632(CONCAT412(fVar132,CONCAT48(fVar129,CONCAT44(fVar127,fVar66))));
      fVar67 = (float)((uint)(bVar57 & 1) * auVar85._0_4_ |
                      (uint)!(bool)(bVar57 & 1) * auVar76._0_4_);
      bVar64 = (bool)((byte)(uVar58 >> 1) & 1);
      fVar128 = (float)((uint)bVar64 * auVar85._4_4_ | (uint)!bVar64 * auVar76._4_4_);
      bVar64 = (bool)((byte)(uVar58 >> 2) & 1);
      fVar130 = (float)((uint)bVar64 * auVar85._8_4_ | (uint)!bVar64 * auVar76._8_4_);
      bVar64 = (bool)((byte)(uVar58 >> 3) & 1);
      fVar133 = (float)((uint)bVar64 * auVar85._12_4_ | (uint)!bVar64 * auVar76._12_4_);
      auVar101 = ZEXT1632(CONCAT412(fVar133,CONCAT48(fVar130,CONCAT44(fVar128,fVar67))));
      auVar100._0_4_ =
           (float)((uint)(bVar57 & 1) * auVar103._0_4_ | (uint)!(bool)(bVar57 & 1) * auVar21._0_4_);
      bVar64 = (bool)((byte)(uVar58 >> 1) & 1);
      auVar100._4_4_ = (float)((uint)bVar64 * auVar103._4_4_ | (uint)!bVar64 * auVar21._4_4_);
      bVar64 = (bool)((byte)(uVar58 >> 2) & 1);
      auVar100._8_4_ = (float)((uint)bVar64 * auVar103._8_4_ | (uint)!bVar64 * auVar21._8_4_);
      bVar64 = (bool)((byte)(uVar58 >> 3) & 1);
      auVar100._12_4_ = (float)((uint)bVar64 * auVar103._12_4_ | (uint)!bVar64 * auVar21._12_4_);
      fVar164 = (float)((uint)((byte)(uVar58 >> 4) & 1) * auVar103._16_4_);
      auVar100._16_4_ = fVar164;
      fVar169 = (float)((uint)((byte)(uVar58 >> 5) & 1) * auVar103._20_4_);
      auVar100._20_4_ = fVar169;
      fVar146 = (float)((uint)((byte)(uVar58 >> 6) & 1) * auVar103._24_4_);
      auVar100._24_4_ = fVar146;
      iVar2 = (uint)(byte)(uVar58 >> 7) * auVar103._28_4_;
      auVar100._28_4_ = iVar2;
      auVar104 = vblendmps_avx512vl(ZEXT1632(auVar79),auVar90);
      auVar111._0_4_ =
           (uint)(bVar57 & 1) * auVar104._0_4_ | (uint)!(bool)(bVar57 & 1) * auVar8._0_4_;
      bVar64 = (bool)((byte)(uVar58 >> 1) & 1);
      auVar111._4_4_ = (uint)bVar64 * auVar104._4_4_ | (uint)!bVar64 * auVar8._4_4_;
      bVar64 = (bool)((byte)(uVar58 >> 2) & 1);
      auVar111._8_4_ = (uint)bVar64 * auVar104._8_4_ | (uint)!bVar64 * auVar8._8_4_;
      bVar64 = (bool)((byte)(uVar58 >> 3) & 1);
      auVar111._12_4_ = (uint)bVar64 * auVar104._12_4_ | (uint)!bVar64 * auVar8._12_4_;
      auVar111._16_4_ = (uint)((byte)(uVar58 >> 4) & 1) * auVar104._16_4_;
      auVar111._20_4_ = (uint)((byte)(uVar58 >> 5) & 1) * auVar104._20_4_;
      auVar111._24_4_ = (uint)((byte)(uVar58 >> 6) & 1) * auVar104._24_4_;
      auVar111._28_4_ = (uint)(byte)(uVar58 >> 7) * auVar104._28_4_;
      auVar104 = vblendmps_avx512vl(ZEXT1632(auVar88),ZEXT1632(auVar87));
      auVar112._0_4_ =
           (float)((uint)(bVar57 & 1) * auVar104._0_4_ | (uint)!(bool)(bVar57 & 1) * auVar85._0_4_);
      bVar64 = (bool)((byte)(uVar58 >> 1) & 1);
      auVar112._4_4_ = (float)((uint)bVar64 * auVar104._4_4_ | (uint)!bVar64 * auVar85._4_4_);
      bVar64 = (bool)((byte)(uVar58 >> 2) & 1);
      auVar112._8_4_ = (float)((uint)bVar64 * auVar104._8_4_ | (uint)!bVar64 * auVar85._8_4_);
      bVar64 = (bool)((byte)(uVar58 >> 3) & 1);
      auVar112._12_4_ = (float)((uint)bVar64 * auVar104._12_4_ | (uint)!bVar64 * auVar85._12_4_);
      fVar170 = (float)((uint)((byte)(uVar58 >> 4) & 1) * auVar104._16_4_);
      auVar112._16_4_ = fVar170;
      fVar165 = (float)((uint)((byte)(uVar58 >> 5) & 1) * auVar104._20_4_);
      auVar112._20_4_ = fVar165;
      fVar171 = (float)((uint)((byte)(uVar58 >> 6) & 1) * auVar104._24_4_);
      auVar112._24_4_ = fVar171;
      auVar112._28_4_ = (uint)(byte)(uVar58 >> 7) * auVar104._28_4_;
      auVar104 = vblendmps_avx512vl(auVar106,ZEXT1632(auVar80));
      auVar113._0_4_ =
           (float)((uint)(bVar57 & 1) * auVar104._0_4_ | (uint)!(bool)(bVar57 & 1) * auVar103._0_4_)
      ;
      bVar64 = (bool)((byte)(uVar58 >> 1) & 1);
      auVar113._4_4_ = (float)((uint)bVar64 * auVar104._4_4_ | (uint)!bVar64 * auVar103._4_4_);
      bVar64 = (bool)((byte)(uVar58 >> 2) & 1);
      auVar113._8_4_ = (float)((uint)bVar64 * auVar104._8_4_ | (uint)!bVar64 * auVar103._8_4_);
      bVar64 = (bool)((byte)(uVar58 >> 3) & 1);
      auVar113._12_4_ = (float)((uint)bVar64 * auVar104._12_4_ | (uint)!bVar64 * auVar103._12_4_);
      bVar64 = (bool)((byte)(uVar58 >> 4) & 1);
      auVar113._16_4_ = (float)((uint)bVar64 * auVar104._16_4_ | (uint)!bVar64 * auVar103._16_4_);
      bVar64 = (bool)((byte)(uVar58 >> 5) & 1);
      auVar113._20_4_ = (float)((uint)bVar64 * auVar104._20_4_ | (uint)!bVar64 * auVar103._20_4_);
      bVar64 = (bool)((byte)(uVar58 >> 6) & 1);
      auVar113._24_4_ = (float)((uint)bVar64 * auVar104._24_4_ | (uint)!bVar64 * auVar103._24_4_);
      bVar64 = SUB81(uVar58 >> 7,0);
      auVar113._28_4_ = (uint)bVar64 * auVar104._28_4_ | (uint)!bVar64 * auVar103._28_4_;
      auVar114._0_4_ =
           (uint)(bVar57 & 1) * (int)auVar79._0_4_ | (uint)!(bool)(bVar57 & 1) * auVar90._0_4_;
      bVar64 = (bool)((byte)(uVar58 >> 1) & 1);
      auVar114._4_4_ = (uint)bVar64 * (int)auVar79._4_4_ | (uint)!bVar64 * auVar90._4_4_;
      bVar64 = (bool)((byte)(uVar58 >> 2) & 1);
      auVar114._8_4_ = (uint)bVar64 * (int)auVar79._8_4_ | (uint)!bVar64 * auVar90._8_4_;
      bVar64 = (bool)((byte)(uVar58 >> 3) & 1);
      auVar114._12_4_ = (uint)bVar64 * (int)auVar79._12_4_ | (uint)!bVar64 * auVar90._12_4_;
      auVar114._16_4_ = (uint)!(bool)((byte)(uVar58 >> 4) & 1) * auVar90._16_4_;
      auVar114._20_4_ = (uint)!(bool)((byte)(uVar58 >> 5) & 1) * auVar90._20_4_;
      auVar114._24_4_ = (uint)!(bool)((byte)(uVar58 >> 6) & 1) * auVar90._24_4_;
      auVar114._28_4_ = (uint)!SUB81(uVar58 >> 7,0) * auVar90._28_4_;
      bVar64 = (bool)((byte)(uVar58 >> 1) & 1);
      bVar15 = (bool)((byte)(uVar58 >> 2) & 1);
      bVar17 = (bool)((byte)(uVar58 >> 3) & 1);
      auVar115._0_4_ =
           (uint)(bVar57 & 1) * auVar106._0_4_ | (uint)!(bool)(bVar57 & 1) * auVar80._0_4_;
      bVar14 = (bool)((byte)(uVar58 >> 1) & 1);
      auVar115._4_4_ = (uint)bVar14 * auVar106._4_4_ | (uint)!bVar14 * auVar80._4_4_;
      bVar14 = (bool)((byte)(uVar58 >> 2) & 1);
      auVar115._8_4_ = (uint)bVar14 * auVar106._8_4_ | (uint)!bVar14 * auVar80._8_4_;
      bVar14 = (bool)((byte)(uVar58 >> 3) & 1);
      auVar115._12_4_ = (uint)bVar14 * auVar106._12_4_ | (uint)!bVar14 * auVar80._12_4_;
      auVar115._16_4_ = (uint)((byte)(uVar58 >> 4) & 1) * auVar106._16_4_;
      auVar115._20_4_ = (uint)((byte)(uVar58 >> 5) & 1) * auVar106._20_4_;
      auVar115._24_4_ = (uint)((byte)(uVar58 >> 6) & 1) * auVar106._24_4_;
      iVar3 = (uint)(byte)(uVar58 >> 7) * auVar106._28_4_;
      auVar115._28_4_ = iVar3;
      auVar92 = vsubps_avx512vl(auVar114,auVar102);
      auVar106 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar17 * (int)auVar88._12_4_ |
                                               (uint)!bVar17 * auVar87._12_4_,
                                               CONCAT48((uint)bVar15 * (int)auVar88._8_4_ |
                                                        (uint)!bVar15 * auVar87._8_4_,
                                                        CONCAT44((uint)bVar64 * (int)auVar88._4_4_ |
                                                                 (uint)!bVar64 * auVar87._4_4_,
                                                                 (uint)(bVar57 & 1) *
                                                                 (int)auVar88._0_4_ |
                                                                 (uint)!(bool)(bVar57 & 1) *
                                                                 auVar87._0_4_)))),auVar101);
      auVar104 = vsubps_avx(auVar115,auVar100);
      auVar103 = vsubps_avx(auVar102,auVar111);
      auVar90 = vsubps_avx(auVar101,auVar112);
      auVar91 = vsubps_avx(auVar100,auVar113);
      auVar94._4_4_ = auVar104._4_4_ * fVar127;
      auVar94._0_4_ = auVar104._0_4_ * fVar66;
      auVar94._8_4_ = auVar104._8_4_ * fVar129;
      auVar94._12_4_ = auVar104._12_4_ * fVar132;
      auVar94._16_4_ = auVar104._16_4_ * 0.0;
      auVar94._20_4_ = auVar104._20_4_ * 0.0;
      auVar94._24_4_ = auVar104._24_4_ * 0.0;
      auVar94._28_4_ = iVar3;
      auVar86 = vfmsub231ps_fma(auVar94,auVar100,auVar92);
      auVar95._4_4_ = fVar128 * auVar92._4_4_;
      auVar95._0_4_ = fVar67 * auVar92._0_4_;
      auVar95._8_4_ = fVar130 * auVar92._8_4_;
      auVar95._12_4_ = fVar133 * auVar92._12_4_;
      auVar95._16_4_ = auVar92._16_4_ * 0.0;
      auVar95._20_4_ = auVar92._20_4_ * 0.0;
      auVar95._24_4_ = auVar92._24_4_ * 0.0;
      auVar95._28_4_ = auVar105._28_4_;
      auVar85 = vfmsub231ps_fma(auVar95,auVar102,auVar106);
      auVar105 = vfmadd231ps_avx512vl(ZEXT1632(auVar85),auVar97,ZEXT1632(auVar86));
      auVar156._0_4_ = auVar106._0_4_ * auVar100._0_4_;
      auVar156._4_4_ = auVar106._4_4_ * auVar100._4_4_;
      auVar156._8_4_ = auVar106._8_4_ * auVar100._8_4_;
      auVar156._12_4_ = auVar106._12_4_ * auVar100._12_4_;
      auVar156._16_4_ = auVar106._16_4_ * fVar164;
      auVar156._20_4_ = auVar106._20_4_ * fVar169;
      auVar156._24_4_ = auVar106._24_4_ * fVar146;
      auVar156._28_4_ = 0;
      auVar86 = vfmsub231ps_fma(auVar156,auVar101,auVar104);
      auVar93 = vfmadd231ps_avx512vl(auVar105,auVar97,ZEXT1632(auVar86));
      auVar105 = vmulps_avx512vl(auVar91,auVar111);
      auVar105 = vfmsub231ps_avx512vl(auVar105,auVar103,auVar113);
      auVar96._4_4_ = auVar90._4_4_ * auVar113._4_4_;
      auVar96._0_4_ = auVar90._0_4_ * auVar113._0_4_;
      auVar96._8_4_ = auVar90._8_4_ * auVar113._8_4_;
      auVar96._12_4_ = auVar90._12_4_ * auVar113._12_4_;
      auVar96._16_4_ = auVar90._16_4_ * auVar113._16_4_;
      auVar96._20_4_ = auVar90._20_4_ * auVar113._20_4_;
      auVar96._24_4_ = auVar90._24_4_ * auVar113._24_4_;
      auVar96._28_4_ = auVar113._28_4_;
      auVar86 = vfmsub231ps_fma(auVar96,auVar112,auVar91);
      auVar157._0_4_ = auVar112._0_4_ * auVar103._0_4_;
      auVar157._4_4_ = auVar112._4_4_ * auVar103._4_4_;
      auVar157._8_4_ = auVar112._8_4_ * auVar103._8_4_;
      auVar157._12_4_ = auVar112._12_4_ * auVar103._12_4_;
      auVar157._16_4_ = fVar170 * auVar103._16_4_;
      auVar157._20_4_ = fVar165 * auVar103._20_4_;
      auVar157._24_4_ = fVar171 * auVar103._24_4_;
      auVar157._28_4_ = 0;
      auVar85 = vfmsub231ps_fma(auVar157,auVar90,auVar111);
      auVar105 = vfmadd231ps_avx512vl(ZEXT1632(auVar85),auVar97,auVar105);
      auVar94 = vfmadd231ps_avx512vl(auVar105,auVar97,ZEXT1632(auVar86));
      auVar105 = vmaxps_avx(auVar93,auVar94);
      uVar139 = vcmpps_avx512vl(auVar105,auVar97,2);
      bVar65 = bVar65 & (byte)uVar139;
      auVar193 = ZEXT3264(local_360);
      auVar195 = ZEXT3264(local_4a0);
      auVar196 = ZEXT3264(local_440);
      auVar188 = ZEXT3264(local_3c0);
      auVar194 = ZEXT3264(local_480);
      if (bVar65 == 0) {
        bVar64 = false;
        auVar105 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar190 = ZEXT3264(auVar105);
        local_3f0 = auVar74;
        local_3e0 = auVar75;
        local_3d0 = auVar78;
      }
      else {
        auVar30._4_4_ = auVar91._4_4_ * auVar106._4_4_;
        auVar30._0_4_ = auVar91._0_4_ * auVar106._0_4_;
        auVar30._8_4_ = auVar91._8_4_ * auVar106._8_4_;
        auVar30._12_4_ = auVar91._12_4_ * auVar106._12_4_;
        auVar30._16_4_ = auVar91._16_4_ * auVar106._16_4_;
        auVar30._20_4_ = auVar91._20_4_ * auVar106._20_4_;
        auVar30._24_4_ = auVar91._24_4_ * auVar106._24_4_;
        auVar30._28_4_ = auVar105._28_4_;
        auVar87 = vfmsub231ps_fma(auVar30,auVar90,auVar104);
        auVar31._4_4_ = auVar104._4_4_ * auVar103._4_4_;
        auVar31._0_4_ = auVar104._0_4_ * auVar103._0_4_;
        auVar31._8_4_ = auVar104._8_4_ * auVar103._8_4_;
        auVar31._12_4_ = auVar104._12_4_ * auVar103._12_4_;
        auVar31._16_4_ = auVar104._16_4_ * auVar103._16_4_;
        auVar31._20_4_ = auVar104._20_4_ * auVar103._20_4_;
        auVar31._24_4_ = auVar104._24_4_ * auVar103._24_4_;
        auVar31._28_4_ = auVar104._28_4_;
        auVar85 = vfmsub231ps_fma(auVar31,auVar92,auVar91);
        auVar32._4_4_ = auVar90._4_4_ * auVar92._4_4_;
        auVar32._0_4_ = auVar90._0_4_ * auVar92._0_4_;
        auVar32._8_4_ = auVar90._8_4_ * auVar92._8_4_;
        auVar32._12_4_ = auVar90._12_4_ * auVar92._12_4_;
        auVar32._16_4_ = auVar90._16_4_ * auVar92._16_4_;
        auVar32._20_4_ = auVar90._20_4_ * auVar92._20_4_;
        auVar32._24_4_ = auVar90._24_4_ * auVar92._24_4_;
        auVar32._28_4_ = auVar90._28_4_;
        auVar80 = vfmsub231ps_fma(auVar32,auVar103,auVar106);
        auVar86 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar85),ZEXT1632(auVar80));
        auVar106 = vfmadd231ps_avx512vl(ZEXT1632(auVar86),ZEXT1632(auVar87),auVar97);
        auVar105 = vrcp14ps_avx512vl(auVar106);
        auVar104 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar190 = ZEXT3264(auVar104);
        auVar103 = vfnmadd213ps_avx512vl(auVar105,auVar106,auVar104);
        auVar86 = vfmadd132ps_fma(auVar103,auVar105,auVar105);
        auVar33._4_4_ = auVar80._4_4_ * auVar100._4_4_;
        auVar33._0_4_ = auVar80._0_4_ * auVar100._0_4_;
        auVar33._8_4_ = auVar80._8_4_ * auVar100._8_4_;
        auVar33._12_4_ = auVar80._12_4_ * auVar100._12_4_;
        auVar33._16_4_ = fVar164 * 0.0;
        auVar33._20_4_ = fVar169 * 0.0;
        auVar33._24_4_ = fVar146 * 0.0;
        auVar33._28_4_ = iVar2;
        auVar85 = vfmadd231ps_fma(auVar33,auVar101,ZEXT1632(auVar85));
        auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar102,ZEXT1632(auVar87));
        fVar146 = auVar86._0_4_;
        fVar169 = auVar86._4_4_;
        fVar170 = auVar86._8_4_;
        fVar171 = auVar86._12_4_;
        local_220 = ZEXT1632(CONCAT412(auVar85._12_4_ * fVar171,
                                       CONCAT48(auVar85._8_4_ * fVar170,
                                                CONCAT44(auVar85._4_4_ * fVar169,
                                                         auVar85._0_4_ * fVar146))));
        auVar167._8_4_ = 3;
        auVar167._0_8_ = 0x300000003;
        auVar167._12_4_ = 3;
        auVar167._16_4_ = 3;
        auVar167._20_4_ = 3;
        auVar167._24_4_ = 3;
        auVar167._28_4_ = 3;
        auVar105 = vpermps_avx2(auVar167,ZEXT1632((undefined1  [16])aVar5));
        uVar139 = vcmpps_avx512vl(auVar105,local_220,2);
        fVar164 = local_530->tfar;
        auVar25._4_4_ = fVar164;
        auVar25._0_4_ = fVar164;
        auVar25._8_4_ = fVar164;
        auVar25._12_4_ = fVar164;
        auVar25._16_4_ = fVar164;
        auVar25._20_4_ = fVar164;
        auVar25._24_4_ = fVar164;
        auVar25._28_4_ = fVar164;
        uVar22 = vcmpps_avx512vl(local_220,auVar25,2);
        bVar65 = (byte)uVar139 & (byte)uVar22 & bVar65;
        local_3f0 = auVar74;
        local_3e0 = auVar75;
        local_3d0 = auVar78;
        if (bVar65 != 0) {
          uVar139 = vcmpps_avx512vl(auVar106,auVar97,4);
          bVar65 = bVar65 & (byte)uVar139;
          if (bVar65 != 0) {
            fVar164 = auVar93._0_4_ * fVar146;
            fVar165 = auVar93._4_4_ * fVar169;
            auVar34._4_4_ = fVar165;
            auVar34._0_4_ = fVar164;
            fVar66 = auVar93._8_4_ * fVar170;
            auVar34._8_4_ = fVar66;
            fVar67 = auVar93._12_4_ * fVar171;
            auVar34._12_4_ = fVar67;
            fVar127 = auVar93._16_4_ * 0.0;
            auVar34._16_4_ = fVar127;
            fVar128 = auVar93._20_4_ * 0.0;
            auVar34._20_4_ = fVar128;
            fVar129 = auVar93._24_4_ * 0.0;
            auVar34._24_4_ = fVar129;
            auVar34._28_4_ = auVar106._28_4_;
            auVar105 = vsubps_avx512vl(auVar104,auVar34);
            local_260._0_4_ =
                 (float)((uint)(bVar57 & 1) * (int)fVar164 |
                        (uint)!(bool)(bVar57 & 1) * auVar105._0_4_);
            bVar64 = (bool)((byte)(uVar58 >> 1) & 1);
            local_260._4_4_ = (float)((uint)bVar64 * (int)fVar165 | (uint)!bVar64 * auVar105._4_4_);
            bVar64 = (bool)((byte)(uVar58 >> 2) & 1);
            local_260._8_4_ = (float)((uint)bVar64 * (int)fVar66 | (uint)!bVar64 * auVar105._8_4_);
            bVar64 = (bool)((byte)(uVar58 >> 3) & 1);
            local_260._12_4_ = (float)((uint)bVar64 * (int)fVar67 | (uint)!bVar64 * auVar105._12_4_)
            ;
            bVar64 = (bool)((byte)(uVar58 >> 4) & 1);
            local_260._16_4_ =
                 (float)((uint)bVar64 * (int)fVar127 | (uint)!bVar64 * auVar105._16_4_);
            bVar64 = (bool)((byte)(uVar58 >> 5) & 1);
            local_260._20_4_ =
                 (float)((uint)bVar64 * (int)fVar128 | (uint)!bVar64 * auVar105._20_4_);
            bVar64 = (bool)((byte)(uVar58 >> 6) & 1);
            local_260._24_4_ =
                 (float)((uint)bVar64 * (int)fVar129 | (uint)!bVar64 * auVar105._24_4_);
            bVar64 = SUB81(uVar58 >> 7,0);
            local_260._28_4_ =
                 (float)((uint)bVar64 * auVar106._28_4_ | (uint)!bVar64 * auVar105._28_4_);
            auVar105 = vsubps_avx(ZEXT1632(auVar73),auVar98);
            auVar86 = vfmadd213ps_fma(auVar105,local_260,auVar98);
            fVar164 = local_520->depth_scale;
            auVar98._4_4_ = fVar164;
            auVar98._0_4_ = fVar164;
            auVar98._8_4_ = fVar164;
            auVar98._12_4_ = fVar164;
            auVar98._16_4_ = fVar164;
            auVar98._20_4_ = fVar164;
            auVar98._24_4_ = fVar164;
            auVar98._28_4_ = fVar164;
            auVar105 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar86._12_4_ + auVar86._12_4_,
                                                          CONCAT48(auVar86._8_4_ + auVar86._8_4_,
                                                                   CONCAT44(auVar86._4_4_ +
                                                                            auVar86._4_4_,
                                                                            auVar86._0_4_ +
                                                                            auVar86._0_4_)))),
                                       auVar98);
            uVar139 = vcmpps_avx512vl(local_220,auVar105,6);
            if (((byte)uVar139 & bVar65) != 0) {
              auVar154._0_4_ = auVar94._0_4_ * fVar146;
              auVar154._4_4_ = auVar94._4_4_ * fVar169;
              auVar154._8_4_ = auVar94._8_4_ * fVar170;
              auVar154._12_4_ = auVar94._12_4_ * fVar171;
              auVar154._16_4_ = auVar94._16_4_ * 0.0;
              auVar154._20_4_ = auVar94._20_4_ * 0.0;
              auVar154._24_4_ = auVar94._24_4_ * 0.0;
              auVar154._28_4_ = 0;
              auVar105 = vsubps_avx512vl(auVar104,auVar154);
              auVar116._0_4_ =
                   (uint)(bVar57 & 1) * (int)auVar154._0_4_ |
                   (uint)!(bool)(bVar57 & 1) * auVar105._0_4_;
              bVar64 = (bool)((byte)(uVar58 >> 1) & 1);
              auVar116._4_4_ = (uint)bVar64 * (int)auVar154._4_4_ | (uint)!bVar64 * auVar105._4_4_;
              bVar64 = (bool)((byte)(uVar58 >> 2) & 1);
              auVar116._8_4_ = (uint)bVar64 * (int)auVar154._8_4_ | (uint)!bVar64 * auVar105._8_4_;
              bVar64 = (bool)((byte)(uVar58 >> 3) & 1);
              auVar116._12_4_ =
                   (uint)bVar64 * (int)auVar154._12_4_ | (uint)!bVar64 * auVar105._12_4_;
              bVar64 = (bool)((byte)(uVar58 >> 4) & 1);
              auVar116._16_4_ =
                   (uint)bVar64 * (int)auVar154._16_4_ | (uint)!bVar64 * auVar105._16_4_;
              bVar64 = (bool)((byte)(uVar58 >> 5) & 1);
              auVar116._20_4_ =
                   (uint)bVar64 * (int)auVar154._20_4_ | (uint)!bVar64 * auVar105._20_4_;
              bVar64 = (bool)((byte)(uVar58 >> 6) & 1);
              auVar116._24_4_ =
                   (uint)bVar64 * (int)auVar154._24_4_ | (uint)!bVar64 * auVar105._24_4_;
              auVar116._28_4_ = (uint)!SUB81(uVar58 >> 7,0) * auVar105._28_4_;
              auVar26._8_4_ = 0x40000000;
              auVar26._0_8_ = 0x4000000040000000;
              auVar26._12_4_ = 0x40000000;
              auVar26._16_4_ = 0x40000000;
              auVar26._20_4_ = 0x40000000;
              auVar26._24_4_ = 0x40000000;
              auVar26._28_4_ = 0x40000000;
              local_240 = vfmsub132ps_avx512vl(auVar116,auVar104,auVar26);
              local_200 = 0;
              local_1fc = iVar9;
              local_1f0 = local_3d0._0_8_;
              uStack_1e8 = local_3d0._8_8_;
              local_1e0 = local_3e0._0_8_;
              uStack_1d8 = local_3e0._8_8_;
              local_1d0 = local_3f0._0_8_;
              uStack_1c8 = local_3f0._8_8_;
              if ((pGVar10->mask & local_530->mask) != 0) {
                if ((local_540->args->filter == (RTCFilterFunctionN)0x0) &&
                   (bVar64 = true, pGVar10->occlusionFilterN == (RTCFilterFunctionN)0x0))
                goto LAB_018aae4a;
                auVar86 = vdivss_avx512f(ZEXT416(0x3f800000),ZEXT416(auVar99._0_4_));
                fVar164 = auVar86._0_4_;
                local_1a0[0] = fVar164 * (local_260._0_4_ + 0.0);
                local_1a0[1] = fVar164 * (local_260._4_4_ + 1.0);
                local_1a0[2] = fVar164 * (local_260._8_4_ + 2.0);
                local_1a0[3] = fVar164 * (local_260._12_4_ + 3.0);
                fStack_190 = fVar164 * (local_260._16_4_ + 4.0);
                fStack_18c = fVar164 * (local_260._20_4_ + 5.0);
                fStack_188 = fVar164 * (local_260._24_4_ + 6.0);
                fStack_184 = local_260._28_4_ + 7.0;
                local_180 = local_240;
                local_160 = local_220;
                uVar58 = 0;
                uVar59 = (ulong)((byte)uVar139 & bVar65);
                for (uVar23 = uVar59; (uVar23 & 1) == 0; uVar23 = uVar23 >> 1 | 0x8000000000000000)
                {
                  uVar58 = uVar58 + 1;
                }
                local_400 = ZEXT416((uint)local_2c0);
                while( true ) {
                  local_2c0 = local_400._0_4_;
                  auVar86 = auVar191._0_16_;
                  if (uVar59 == 0) break;
                  local_2a0._0_8_ = uVar59;
                  local_4d4 = local_1a0[uVar58];
                  local_4d0 = *(undefined4 *)(local_180 + uVar58 * 4);
                  local_2c0 = local_530->tfar;
                  local_530->tfar = *(float *)(local_160 + uVar58 * 4);
                  local_510.context = local_540->user;
                  auVar85 = vsubss_avx512f(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)local_4d4));
                  fVar146 = auVar85._0_4_;
                  fVar164 = fVar146 * fVar146 * -3.0;
                  auVar85 = vfmadd231ss_fma(ZEXT416((uint)(fVar146 * fVar146)),
                                            ZEXT416((uint)(local_4d4 * fVar146)),ZEXT416(0xc0000000)
                                           );
                  auVar87 = vfmsub132ss_fma(ZEXT416((uint)(local_4d4 * fVar146)),
                                            ZEXT416((uint)(local_4d4 * local_4d4)),
                                            ZEXT416(0x40000000));
                  fVar146 = auVar85._0_4_ * 3.0;
                  fVar169 = auVar87._0_4_ * 3.0;
                  fVar170 = local_4d4 * local_4d4 * 3.0;
                  auVar162._0_4_ = fVar170 * (float)local_310._0_4_;
                  auVar162._4_4_ = fVar170 * (float)local_310._4_4_;
                  auVar162._8_4_ = fVar170 * fStack_308;
                  auVar162._12_4_ = fVar170 * fStack_304;
                  auVar147._4_4_ = fVar169;
                  auVar147._0_4_ = fVar169;
                  auVar147._8_4_ = fVar169;
                  auVar147._12_4_ = fVar169;
                  auVar85 = vfmadd132ps_fma(auVar147,auVar162,local_3f0);
                  auVar152._4_4_ = fVar146;
                  auVar152._0_4_ = fVar146;
                  auVar152._8_4_ = fVar146;
                  auVar152._12_4_ = fVar146;
                  auVar85 = vfmadd132ps_fma(auVar152,auVar85,local_3e0);
                  auVar148._4_4_ = fVar164;
                  auVar148._0_4_ = fVar164;
                  auVar148._8_4_ = fVar164;
                  auVar148._12_4_ = fVar164;
                  auVar85 = vfmadd132ps_fma(auVar148,auVar85,local_3d0);
                  local_4e0 = vmovlps_avx(auVar85);
                  local_4d8 = vextractps_avx(auVar85,2);
                  local_4cc = (int)local_4a8;
                  local_4c8 = (int)local_528;
                  local_4c4 = (local_510.context)->instID[0];
                  local_4c0 = (local_510.context)->instPrimID[0];
                  local_544 = -1;
                  local_510.valid = &local_544;
                  local_510.geometryUserPtr = pGVar10->userPtr;
                  local_510.ray = (RTCRayN *)local_530;
                  local_510.hit = (RTCHitN *)&local_4e0;
                  local_510.N = 1;
                  if ((pGVar10->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                     ((*pGVar10->occlusionFilterN)(&local_510), *local_510.valid != 0)) {
                    p_Var13 = local_540->args->filter;
                    if ((p_Var13 == (RTCFilterFunctionN)0x0) ||
                       ((((local_540->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                          RTC_RAY_QUERY_FLAG_INCOHERENT &&
                         (((pGVar10->field_8).field_0x2 & 0x40) == 0)) ||
                        ((*p_Var13)(&local_510), *local_510.valid != 0)))) {
                      bVar64 = true;
                      auVar105 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                      auVar190 = ZEXT3264(auVar105);
                      auVar86 = vxorps_avx512vl(auVar86,auVar86);
                      auVar191 = ZEXT1664(auVar86);
                      auVar192 = ZEXT3264(local_340);
                      auVar193 = ZEXT3264(local_360);
                      auVar189 = ZEXT3264(local_420);
                      auVar195 = ZEXT3264(local_4a0);
                      auVar196 = ZEXT3264(local_440);
                      auVar197 = ZEXT3264(local_460);
                      auVar188 = ZEXT3264(local_3c0);
                      auVar194 = ZEXT3264(local_480);
                      local_2c0 = local_400._0_4_;
                      goto LAB_018aae4a;
                    }
                  }
                  local_530->tfar = local_2c0;
                  uVar23 = uVar58 & 0x3f;
                  uVar58 = 0;
                  uVar59 = local_2a0._0_8_ ^ 1L << uVar23;
                  for (uVar23 = uVar59; (uVar23 & 1) == 0; uVar23 = uVar23 >> 1 | 0x8000000000000000
                      ) {
                    uVar58 = uVar58 + 1;
                  }
                  auVar105 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                  auVar190 = ZEXT3264(auVar105);
                  auVar86 = vxorps_avx512vl(auVar86,auVar86);
                  auVar191 = ZEXT1664(auVar86);
                  auVar192 = ZEXT3264(local_340);
                  auVar193 = ZEXT3264(local_360);
                  auVar189 = ZEXT3264(local_420);
                  auVar195 = ZEXT3264(local_4a0);
                  auVar196 = ZEXT3264(local_440);
                  auVar197 = ZEXT3264(local_460);
                  auVar105 = vmovdqa64_avx512vl(local_3c0);
                  auVar188 = ZEXT3264(auVar105);
                  auVar194 = ZEXT3264(local_480);
                }
              }
            }
          }
        }
        bVar64 = false;
      }
    }
LAB_018aae4a:
    ray = local_530;
    if (8 < iVar9) {
      local_2a0 = vpbroadcastd_avx512vl();
      fStack_2bc = local_2c0;
      fStack_2b8 = local_2c0;
      fStack_2b4 = local_2c0;
      fStack_2b0 = local_2c0;
      fStack_2ac = local_2c0;
      fStack_2a8 = local_2c0;
      fStack_2a4 = local_2c0;
      auVar138._8_4_ = 3;
      auVar138._0_8_ = 0x300000003;
      auVar138._12_4_ = 3;
      auVar138._16_4_ = 3;
      auVar138._20_4_ = 3;
      auVar138._24_4_ = 3;
      auVar138._28_4_ = 3;
      local_2e0 = vpermps_avx2(auVar138,local_2e0);
      auVar86 = vdivss_avx512f(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)local_300._0_4_));
      local_300._4_4_ = auVar86._0_4_;
      local_300._0_4_ = local_300._4_4_;
      fStack_2f8 = (float)local_300._4_4_;
      fStack_2f4 = (float)local_300._4_4_;
      fStack_2f0 = (float)local_300._4_4_;
      fStack_2ec = (float)local_300._4_4_;
      fStack_2e8 = (float)local_300._4_4_;
      fStack_2e4 = (float)local_300._4_4_;
      local_4a0 = auVar195._0_32_;
      local_3c0 = auVar188._0_32_;
      uVar58 = local_528;
      for (lVar62 = 8; lVar62 < local_538; lVar62 = lVar62 + 8) {
        auVar105 = vpbroadcastd_avx512vl();
        auVar90 = vpor_avx2(auVar105,_DAT_01fb4ba0);
        uVar22 = vpcmpd_avx512vl(auVar90,local_2a0,1);
        auVar105 = *(undefined1 (*) [32])(bezier_basis0 + lVar62 * 4 + lVar61);
        auVar106 = *(undefined1 (*) [32])(lVar61 + 0x21fb768 + lVar62 * 4);
        auVar104 = *(undefined1 (*) [32])(lVar61 + 0x21fbbec + lVar62 * 4);
        auVar103 = *(undefined1 (*) [32])(lVar61 + 0x21fc070 + lVar62 * 4);
        auVar107 = auVar188._0_32_;
        auVar91 = vmulps_avx512vl(auVar107,auVar103);
        auVar109 = auVar194._0_32_;
        auVar102 = vmulps_avx512vl(auVar109,auVar103);
        auVar35._4_4_ = auVar103._4_4_ * (float)local_e0._4_4_;
        auVar35._0_4_ = auVar103._0_4_ * (float)local_e0._0_4_;
        auVar35._8_4_ = auVar103._8_4_ * fStack_d8;
        auVar35._12_4_ = auVar103._12_4_ * fStack_d4;
        auVar35._16_4_ = auVar103._16_4_ * fStack_d0;
        auVar35._20_4_ = auVar103._20_4_ * fStack_cc;
        auVar35._24_4_ = auVar103._24_4_ * fStack_c8;
        auVar35._28_4_ = auVar90._28_4_;
        auVar111 = auVar196._0_32_;
        auVar90 = vfmadd231ps_avx512vl(auVar91,auVar104,auVar111);
        auVar112 = auVar197._0_32_;
        auVar91 = vfmadd231ps_avx512vl(auVar102,auVar104,auVar112);
        auVar102 = vfmadd231ps_avx512vl(auVar35,auVar104,local_c0);
        auVar108 = auVar189._0_32_;
        auVar90 = vfmadd231ps_avx512vl(auVar90,auVar106,auVar108);
        auVar110 = auVar195._0_32_;
        auVar91 = vfmadd231ps_avx512vl(auVar91,auVar106,auVar110);
        auVar86 = vfmadd231ps_fma(auVar102,auVar106,local_a0);
        local_340 = auVar192._0_32_;
        auVar93 = vfmadd231ps_avx512vl(auVar90,auVar105,local_340);
        local_360 = auVar193._0_32_;
        auVar94 = vfmadd231ps_avx512vl(auVar91,auVar105,local_360);
        auVar90 = *(undefined1 (*) [32])(bezier_basis1 + lVar62 * 4 + lVar61);
        auVar91 = *(undefined1 (*) [32])(lVar61 + 0x21fdb88 + lVar62 * 4);
        auVar86 = vfmadd231ps_fma(ZEXT1632(auVar86),auVar105,local_80);
        auVar102 = *(undefined1 (*) [32])(lVar61 + 0x21fe00c + lVar62 * 4);
        auVar101 = *(undefined1 (*) [32])(lVar61 + 0x21fe490 + lVar62 * 4);
        auVar92 = vmulps_avx512vl(auVar107,auVar101);
        auVar95 = vmulps_avx512vl(auVar109,auVar101);
        auVar36._4_4_ = auVar101._4_4_ * (float)local_e0._4_4_;
        auVar36._0_4_ = auVar101._0_4_ * (float)local_e0._0_4_;
        auVar36._8_4_ = auVar101._8_4_ * fStack_d8;
        auVar36._12_4_ = auVar101._12_4_ * fStack_d4;
        auVar36._16_4_ = auVar101._16_4_ * fStack_d0;
        auVar36._20_4_ = auVar101._20_4_ * fStack_cc;
        auVar36._24_4_ = auVar101._24_4_ * fStack_c8;
        auVar36._28_4_ = uStack_c4;
        auVar92 = vfmadd231ps_avx512vl(auVar92,auVar102,auVar111);
        auVar95 = vfmadd231ps_avx512vl(auVar95,auVar102,auVar112);
        auVar96 = vfmadd231ps_avx512vl(auVar36,auVar102,local_c0);
        auVar92 = vfmadd231ps_avx512vl(auVar92,auVar91,auVar108);
        auVar95 = vfmadd231ps_avx512vl(auVar95,auVar91,auVar110);
        auVar85 = vfmadd231ps_fma(auVar96,auVar91,local_a0);
        auVar96 = vfmadd231ps_avx512vl(auVar92,auVar90,local_340);
        auVar95 = vfmadd231ps_avx512vl(auVar95,auVar90,local_360);
        auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar90,local_80);
        auVar97 = vmaxps_avx512vl(ZEXT1632(auVar86),ZEXT1632(auVar85));
        auVar92 = vsubps_avx(auVar96,auVar93);
        auVar98 = vsubps_avx512vl(auVar95,auVar94);
        auVar99 = vmulps_avx512vl(auVar94,auVar92);
        auVar100 = vmulps_avx512vl(auVar93,auVar98);
        auVar99 = vsubps_avx512vl(auVar99,auVar100);
        auVar100 = vmulps_avx512vl(auVar98,auVar98);
        auVar100 = vfmadd231ps_avx512vl(auVar100,auVar92,auVar92);
        auVar97 = vmulps_avx512vl(auVar97,auVar97);
        auVar97 = vmulps_avx512vl(auVar97,auVar100);
        auVar99 = vmulps_avx512vl(auVar99,auVar99);
        uVar139 = vcmpps_avx512vl(auVar99,auVar97,2);
        bVar65 = (byte)uVar22 & (byte)uVar139;
        if (bVar65 == 0) {
          auVar189 = ZEXT3264(auVar108);
          auVar196 = ZEXT3264(auVar111);
          auVar188 = ZEXT3264(auVar107);
        }
        else {
          fVar164 = local_3a0._0_4_;
          fVar146 = local_3a0._4_4_;
          auVar37._4_4_ = fVar146 * auVar101._4_4_;
          auVar37._0_4_ = fVar164 * auVar101._0_4_;
          fVar169 = local_3a0._8_4_;
          auVar37._8_4_ = fVar169 * auVar101._8_4_;
          fVar170 = local_3a0._12_4_;
          auVar37._12_4_ = fVar170 * auVar101._12_4_;
          fVar171 = local_3a0._16_4_;
          auVar37._16_4_ = fVar171 * auVar101._16_4_;
          fVar165 = local_3a0._20_4_;
          auVar37._20_4_ = fVar165 * auVar101._20_4_;
          fVar66 = local_3a0._24_4_;
          auVar37._24_4_ = fVar66 * auVar101._24_4_;
          auVar37._28_4_ = auVar101._28_4_;
          auVar102 = vfmadd213ps_avx512vl(auVar102,local_140,auVar37);
          auVar91 = vfmadd213ps_avx512vl(auVar91,local_120,auVar102);
          auVar90 = vfmadd213ps_avx512vl(auVar90,local_100,auVar91);
          auVar38._4_4_ = fVar146 * auVar103._4_4_;
          auVar38._0_4_ = fVar164 * auVar103._0_4_;
          auVar38._8_4_ = fVar169 * auVar103._8_4_;
          auVar38._12_4_ = fVar170 * auVar103._12_4_;
          auVar38._16_4_ = fVar171 * auVar103._16_4_;
          auVar38._20_4_ = fVar165 * auVar103._20_4_;
          auVar38._24_4_ = fVar66 * auVar103._24_4_;
          auVar38._28_4_ = auVar103._28_4_;
          auVar104 = vfmadd213ps_avx512vl(auVar104,local_140,auVar38);
          auVar106 = vfmadd213ps_avx512vl(auVar106,local_120,auVar104);
          auVar91 = vfmadd213ps_avx512vl(auVar105,local_100,auVar106);
          auVar105 = *(undefined1 (*) [32])(lVar61 + 0x21fc4f4 + lVar62 * 4);
          auVar106 = *(undefined1 (*) [32])(lVar61 + 0x21fc978 + lVar62 * 4);
          auVar104 = *(undefined1 (*) [32])(lVar61 + 0x21fcdfc + lVar62 * 4);
          auVar103 = *(undefined1 (*) [32])(lVar61 + 0x21fd280 + lVar62 * 4);
          auVar102 = vmulps_avx512vl(auVar107,auVar103);
          auVar101 = vmulps_avx512vl(auVar109,auVar103);
          auVar39._4_4_ = fVar146 * auVar103._4_4_;
          auVar39._0_4_ = fVar164 * auVar103._0_4_;
          auVar39._8_4_ = fVar169 * auVar103._8_4_;
          auVar39._12_4_ = fVar170 * auVar103._12_4_;
          auVar39._16_4_ = fVar171 * auVar103._16_4_;
          auVar39._20_4_ = fVar165 * auVar103._20_4_;
          auVar39._24_4_ = fVar66 * auVar103._24_4_;
          auVar39._28_4_ = auVar103._28_4_;
          auVar103 = vfmadd231ps_avx512vl(auVar102,auVar104,auVar111);
          auVar102 = vfmadd231ps_avx512vl(auVar101,auVar104,auVar112);
          auVar104 = vfmadd231ps_avx512vl(auVar39,local_140,auVar104);
          auVar103 = vfmadd231ps_avx512vl(auVar103,auVar106,auVar108);
          auVar102 = vfmadd231ps_avx512vl(auVar102,auVar106,auVar110);
          auVar106 = vfmadd231ps_avx512vl(auVar104,local_120,auVar106);
          auVar103 = vfmadd231ps_avx512vl(auVar103,auVar105,local_340);
          auVar102 = vfmadd231ps_avx512vl(auVar102,auVar105,local_360);
          auVar101 = vfmadd231ps_avx512vl(auVar106,local_100,auVar105);
          auVar105 = *(undefined1 (*) [32])(lVar61 + 0x21fe914 + lVar62 * 4);
          auVar106 = *(undefined1 (*) [32])(lVar61 + 0x21ff21c + lVar62 * 4);
          auVar104 = *(undefined1 (*) [32])(lVar61 + 0x21ff6a0 + lVar62 * 4);
          auVar97 = vmulps_avx512vl(auVar107,auVar104);
          auVar99 = vmulps_avx512vl(auVar109,auVar104);
          auVar104 = vmulps_avx512vl(local_3a0,auVar104);
          auVar97 = vfmadd231ps_avx512vl(auVar97,auVar106,auVar111);
          auVar99 = vfmadd231ps_avx512vl(auVar99,auVar106,auVar112);
          auVar104 = vfmadd231ps_avx512vl(auVar104,local_140,auVar106);
          auVar106 = *(undefined1 (*) [32])(lVar61 + 0x21fed98 + lVar62 * 4);
          auVar97 = vfmadd231ps_avx512vl(auVar97,auVar106,auVar108);
          auVar87 = vfmadd231ps_fma(auVar99,auVar106,local_4a0);
          auVar106 = vfmadd231ps_avx512vl(auVar104,local_120,auVar106);
          auVar104 = vfmadd231ps_avx512vl(auVar97,auVar105,local_340);
          auVar97 = vfmadd231ps_avx512vl(ZEXT1632(auVar87),auVar105,local_360);
          auVar106 = vfmadd231ps_avx512vl(auVar106,local_100,auVar105);
          auVar99 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          vandps_avx512vl(auVar103,auVar99);
          vandps_avx512vl(auVar102,auVar99);
          auVar105 = vmaxps_avx(auVar99,auVar99);
          vandps_avx512vl(auVar101,auVar99);
          auVar105 = vmaxps_avx(auVar105,auVar99);
          auVar56._4_4_ = fStack_2bc;
          auVar56._0_4_ = local_2c0;
          auVar56._8_4_ = fStack_2b8;
          auVar56._12_4_ = fStack_2b4;
          auVar56._16_4_ = fStack_2b0;
          auVar56._20_4_ = fStack_2ac;
          auVar56._24_4_ = fStack_2a8;
          auVar56._28_4_ = fStack_2a4;
          uVar23 = vcmpps_avx512vl(auVar105,auVar56,1);
          bVar14 = (bool)((byte)uVar23 & 1);
          auVar117._0_4_ = (float)((uint)bVar14 * auVar92._0_4_ | (uint)!bVar14 * auVar103._0_4_);
          bVar14 = (bool)((byte)(uVar23 >> 1) & 1);
          auVar117._4_4_ = (float)((uint)bVar14 * auVar92._4_4_ | (uint)!bVar14 * auVar103._4_4_);
          bVar14 = (bool)((byte)(uVar23 >> 2) & 1);
          auVar117._8_4_ = (float)((uint)bVar14 * auVar92._8_4_ | (uint)!bVar14 * auVar103._8_4_);
          bVar14 = (bool)((byte)(uVar23 >> 3) & 1);
          auVar117._12_4_ = (float)((uint)bVar14 * auVar92._12_4_ | (uint)!bVar14 * auVar103._12_4_)
          ;
          bVar14 = (bool)((byte)(uVar23 >> 4) & 1);
          auVar117._16_4_ = (float)((uint)bVar14 * auVar92._16_4_ | (uint)!bVar14 * auVar103._16_4_)
          ;
          bVar14 = (bool)((byte)(uVar23 >> 5) & 1);
          auVar117._20_4_ = (float)((uint)bVar14 * auVar92._20_4_ | (uint)!bVar14 * auVar103._20_4_)
          ;
          bVar14 = (bool)((byte)(uVar23 >> 6) & 1);
          auVar117._24_4_ = (float)((uint)bVar14 * auVar92._24_4_ | (uint)!bVar14 * auVar103._24_4_)
          ;
          bVar14 = SUB81(uVar23 >> 7,0);
          auVar117._28_4_ = (uint)bVar14 * auVar92._28_4_ | (uint)!bVar14 * auVar103._28_4_;
          bVar14 = (bool)((byte)uVar23 & 1);
          auVar118._0_4_ = (float)((uint)bVar14 * auVar98._0_4_ | (uint)!bVar14 * auVar102._0_4_);
          bVar14 = (bool)((byte)(uVar23 >> 1) & 1);
          auVar118._4_4_ = (float)((uint)bVar14 * auVar98._4_4_ | (uint)!bVar14 * auVar102._4_4_);
          bVar14 = (bool)((byte)(uVar23 >> 2) & 1);
          auVar118._8_4_ = (float)((uint)bVar14 * auVar98._8_4_ | (uint)!bVar14 * auVar102._8_4_);
          bVar14 = (bool)((byte)(uVar23 >> 3) & 1);
          auVar118._12_4_ = (float)((uint)bVar14 * auVar98._12_4_ | (uint)!bVar14 * auVar102._12_4_)
          ;
          bVar14 = (bool)((byte)(uVar23 >> 4) & 1);
          auVar118._16_4_ = (float)((uint)bVar14 * auVar98._16_4_ | (uint)!bVar14 * auVar102._16_4_)
          ;
          bVar14 = (bool)((byte)(uVar23 >> 5) & 1);
          auVar118._20_4_ = (float)((uint)bVar14 * auVar98._20_4_ | (uint)!bVar14 * auVar102._20_4_)
          ;
          bVar14 = (bool)((byte)(uVar23 >> 6) & 1);
          auVar118._24_4_ = (float)((uint)bVar14 * auVar98._24_4_ | (uint)!bVar14 * auVar102._24_4_)
          ;
          bVar14 = SUB81(uVar23 >> 7,0);
          auVar118._28_4_ = (uint)bVar14 * auVar98._28_4_ | (uint)!bVar14 * auVar102._28_4_;
          vandps_avx512vl(auVar104,auVar99);
          vandps_avx512vl(auVar97,auVar99);
          auVar105 = vmaxps_avx(auVar118,auVar118);
          vandps_avx512vl(auVar106,auVar99);
          auVar105 = vmaxps_avx(auVar105,auVar118);
          uVar23 = vcmpps_avx512vl(auVar105,auVar56,1);
          bVar14 = (bool)((byte)uVar23 & 1);
          auVar119._0_4_ = (uint)bVar14 * auVar92._0_4_ | (uint)!bVar14 * auVar104._0_4_;
          bVar14 = (bool)((byte)(uVar23 >> 1) & 1);
          auVar119._4_4_ = (uint)bVar14 * auVar92._4_4_ | (uint)!bVar14 * auVar104._4_4_;
          bVar14 = (bool)((byte)(uVar23 >> 2) & 1);
          auVar119._8_4_ = (uint)bVar14 * auVar92._8_4_ | (uint)!bVar14 * auVar104._8_4_;
          bVar14 = (bool)((byte)(uVar23 >> 3) & 1);
          auVar119._12_4_ = (uint)bVar14 * auVar92._12_4_ | (uint)!bVar14 * auVar104._12_4_;
          bVar14 = (bool)((byte)(uVar23 >> 4) & 1);
          auVar119._16_4_ = (uint)bVar14 * auVar92._16_4_ | (uint)!bVar14 * auVar104._16_4_;
          bVar14 = (bool)((byte)(uVar23 >> 5) & 1);
          auVar119._20_4_ = (uint)bVar14 * auVar92._20_4_ | (uint)!bVar14 * auVar104._20_4_;
          bVar14 = (bool)((byte)(uVar23 >> 6) & 1);
          auVar119._24_4_ = (uint)bVar14 * auVar92._24_4_ | (uint)!bVar14 * auVar104._24_4_;
          bVar14 = SUB81(uVar23 >> 7,0);
          auVar119._28_4_ = (uint)bVar14 * auVar92._28_4_ | (uint)!bVar14 * auVar104._28_4_;
          bVar14 = (bool)((byte)uVar23 & 1);
          auVar120._0_4_ = (float)((uint)bVar14 * auVar98._0_4_ | (uint)!bVar14 * auVar97._0_4_);
          bVar14 = (bool)((byte)(uVar23 >> 1) & 1);
          auVar120._4_4_ = (float)((uint)bVar14 * auVar98._4_4_ | (uint)!bVar14 * auVar97._4_4_);
          bVar14 = (bool)((byte)(uVar23 >> 2) & 1);
          auVar120._8_4_ = (float)((uint)bVar14 * auVar98._8_4_ | (uint)!bVar14 * auVar97._8_4_);
          bVar14 = (bool)((byte)(uVar23 >> 3) & 1);
          auVar120._12_4_ = (float)((uint)bVar14 * auVar98._12_4_ | (uint)!bVar14 * auVar97._12_4_);
          bVar14 = (bool)((byte)(uVar23 >> 4) & 1);
          auVar120._16_4_ = (float)((uint)bVar14 * auVar98._16_4_ | (uint)!bVar14 * auVar97._16_4_);
          bVar14 = (bool)((byte)(uVar23 >> 5) & 1);
          auVar120._20_4_ = (float)((uint)bVar14 * auVar98._20_4_ | (uint)!bVar14 * auVar97._20_4_);
          bVar14 = (bool)((byte)(uVar23 >> 6) & 1);
          auVar120._24_4_ = (float)((uint)bVar14 * auVar98._24_4_ | (uint)!bVar14 * auVar97._24_4_);
          bVar14 = SUB81(uVar23 >> 7,0);
          auVar120._28_4_ = (uint)bVar14 * auVar98._28_4_ | (uint)!bVar14 * auVar97._28_4_;
          auVar175._8_4_ = 0x80000000;
          auVar175._0_8_ = 0x8000000080000000;
          auVar175._12_4_ = 0x80000000;
          auVar175._16_4_ = 0x80000000;
          auVar175._20_4_ = 0x80000000;
          auVar175._24_4_ = 0x80000000;
          auVar175._28_4_ = 0x80000000;
          auVar105 = vxorps_avx512vl(auVar119,auVar175);
          auVar98 = auVar191._0_32_;
          auVar106 = vfmadd213ps_avx512vl(auVar117,auVar117,auVar98);
          auVar87 = vfmadd231ps_fma(auVar106,auVar118,auVar118);
          auVar106 = vrsqrt14ps_avx512vl(ZEXT1632(auVar87));
          auVar187._8_4_ = 0xbf000000;
          auVar187._0_8_ = 0xbf000000bf000000;
          auVar187._12_4_ = 0xbf000000;
          auVar187._16_4_ = 0xbf000000;
          auVar187._20_4_ = 0xbf000000;
          auVar187._24_4_ = 0xbf000000;
          auVar187._28_4_ = 0xbf000000;
          fVar164 = auVar106._0_4_;
          fVar146 = auVar106._4_4_;
          fVar169 = auVar106._8_4_;
          fVar170 = auVar106._12_4_;
          fVar171 = auVar106._16_4_;
          fVar165 = auVar106._20_4_;
          fVar66 = auVar106._24_4_;
          auVar40._4_4_ = fVar146 * fVar146 * fVar146 * auVar87._4_4_ * -0.5;
          auVar40._0_4_ = fVar164 * fVar164 * fVar164 * auVar87._0_4_ * -0.5;
          auVar40._8_4_ = fVar169 * fVar169 * fVar169 * auVar87._8_4_ * -0.5;
          auVar40._12_4_ = fVar170 * fVar170 * fVar170 * auVar87._12_4_ * -0.5;
          auVar40._16_4_ = fVar171 * fVar171 * fVar171 * -0.0;
          auVar40._20_4_ = fVar165 * fVar165 * fVar165 * -0.0;
          auVar40._24_4_ = fVar66 * fVar66 * fVar66 * -0.0;
          auVar40._28_4_ = auVar118._28_4_;
          auVar104 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
          auVar106 = vfmadd231ps_avx512vl(auVar40,auVar104,auVar106);
          auVar41._4_4_ = auVar118._4_4_ * auVar106._4_4_;
          auVar41._0_4_ = auVar118._0_4_ * auVar106._0_4_;
          auVar41._8_4_ = auVar118._8_4_ * auVar106._8_4_;
          auVar41._12_4_ = auVar118._12_4_ * auVar106._12_4_;
          auVar41._16_4_ = auVar118._16_4_ * auVar106._16_4_;
          auVar41._20_4_ = auVar118._20_4_ * auVar106._20_4_;
          auVar41._24_4_ = auVar118._24_4_ * auVar106._24_4_;
          auVar41._28_4_ = 0;
          auVar42._4_4_ = auVar106._4_4_ * -auVar117._4_4_;
          auVar42._0_4_ = auVar106._0_4_ * -auVar117._0_4_;
          auVar42._8_4_ = auVar106._8_4_ * -auVar117._8_4_;
          auVar42._12_4_ = auVar106._12_4_ * -auVar117._12_4_;
          auVar42._16_4_ = auVar106._16_4_ * -auVar117._16_4_;
          auVar42._20_4_ = auVar106._20_4_ * -auVar117._20_4_;
          auVar42._24_4_ = auVar106._24_4_ * -auVar117._24_4_;
          auVar42._28_4_ = auVar118._28_4_;
          auVar103 = vmulps_avx512vl(auVar106,auVar98);
          auVar106 = vfmadd213ps_avx512vl(auVar119,auVar119,auVar98);
          auVar106 = vfmadd231ps_avx512vl(auVar106,auVar120,auVar120);
          auVar102 = vrsqrt14ps_avx512vl(auVar106);
          auVar106 = vmulps_avx512vl(auVar106,auVar187);
          fVar164 = auVar102._0_4_;
          fVar146 = auVar102._4_4_;
          fVar169 = auVar102._8_4_;
          fVar170 = auVar102._12_4_;
          fVar171 = auVar102._16_4_;
          fVar165 = auVar102._20_4_;
          fVar66 = auVar102._24_4_;
          auVar43._4_4_ = fVar146 * fVar146 * fVar146 * auVar106._4_4_;
          auVar43._0_4_ = fVar164 * fVar164 * fVar164 * auVar106._0_4_;
          auVar43._8_4_ = fVar169 * fVar169 * fVar169 * auVar106._8_4_;
          auVar43._12_4_ = fVar170 * fVar170 * fVar170 * auVar106._12_4_;
          auVar43._16_4_ = fVar171 * fVar171 * fVar171 * auVar106._16_4_;
          auVar43._20_4_ = fVar165 * fVar165 * fVar165 * auVar106._20_4_;
          auVar43._24_4_ = fVar66 * fVar66 * fVar66 * auVar106._24_4_;
          auVar43._28_4_ = auVar106._28_4_;
          auVar106 = vfmadd231ps_avx512vl(auVar43,auVar104,auVar102);
          auVar44._4_4_ = auVar120._4_4_ * auVar106._4_4_;
          auVar44._0_4_ = auVar120._0_4_ * auVar106._0_4_;
          auVar44._8_4_ = auVar120._8_4_ * auVar106._8_4_;
          auVar44._12_4_ = auVar120._12_4_ * auVar106._12_4_;
          auVar44._16_4_ = auVar120._16_4_ * auVar106._16_4_;
          auVar44._20_4_ = auVar120._20_4_ * auVar106._20_4_;
          auVar44._24_4_ = auVar120._24_4_ * auVar106._24_4_;
          auVar44._28_4_ = auVar102._28_4_;
          auVar45._4_4_ = auVar106._4_4_ * auVar105._4_4_;
          auVar45._0_4_ = auVar106._0_4_ * auVar105._0_4_;
          auVar45._8_4_ = auVar106._8_4_ * auVar105._8_4_;
          auVar45._12_4_ = auVar106._12_4_ * auVar105._12_4_;
          auVar45._16_4_ = auVar106._16_4_ * auVar105._16_4_;
          auVar45._20_4_ = auVar106._20_4_ * auVar105._20_4_;
          auVar45._24_4_ = auVar106._24_4_ * auVar105._24_4_;
          auVar45._28_4_ = auVar105._28_4_;
          auVar105 = vmulps_avx512vl(auVar106,auVar98);
          auVar87 = vfmadd213ps_fma(auVar41,ZEXT1632(auVar86),auVar93);
          auVar106 = ZEXT1632(auVar86);
          auVar80 = vfmadd213ps_fma(auVar42,auVar106,auVar94);
          auVar104 = vfmadd213ps_avx512vl(auVar103,auVar106,auVar91);
          auVar102 = vfmadd213ps_avx512vl(auVar44,ZEXT1632(auVar85),auVar96);
          auVar74 = vfnmadd213ps_fma(auVar41,auVar106,auVar93);
          auVar101 = ZEXT1632(auVar85);
          auVar8 = vfmadd213ps_fma(auVar45,auVar101,auVar95);
          auVar75 = vfnmadd213ps_fma(auVar42,auVar106,auVar94);
          auVar77 = vfmadd213ps_fma(auVar105,auVar101,auVar90);
          auVar97 = ZEXT1632(auVar86);
          auVar88 = vfnmadd231ps_fma(auVar91,auVar97,auVar103);
          auVar78 = vfnmadd213ps_fma(auVar44,auVar101,auVar96);
          auVar79 = vfnmadd213ps_fma(auVar45,auVar101,auVar95);
          auVar20 = vfnmadd231ps_fma(auVar90,ZEXT1632(auVar85),auVar105);
          auVar90 = vsubps_avx512vl(auVar102,ZEXT1632(auVar74));
          auVar105 = vsubps_avx(ZEXT1632(auVar8),ZEXT1632(auVar75));
          auVar106 = vsubps_avx(ZEXT1632(auVar77),ZEXT1632(auVar88));
          auVar46._4_4_ = auVar105._4_4_ * auVar88._4_4_;
          auVar46._0_4_ = auVar105._0_4_ * auVar88._0_4_;
          auVar46._8_4_ = auVar105._8_4_ * auVar88._8_4_;
          auVar46._12_4_ = auVar105._12_4_ * auVar88._12_4_;
          auVar46._16_4_ = auVar105._16_4_ * 0.0;
          auVar46._20_4_ = auVar105._20_4_ * 0.0;
          auVar46._24_4_ = auVar105._24_4_ * 0.0;
          auVar46._28_4_ = auVar103._28_4_;
          auVar86 = vfmsub231ps_fma(auVar46,ZEXT1632(auVar75),auVar106);
          auVar47._4_4_ = auVar106._4_4_ * auVar74._4_4_;
          auVar47._0_4_ = auVar106._0_4_ * auVar74._0_4_;
          auVar47._8_4_ = auVar106._8_4_ * auVar74._8_4_;
          auVar47._12_4_ = auVar106._12_4_ * auVar74._12_4_;
          auVar47._16_4_ = auVar106._16_4_ * 0.0;
          auVar47._20_4_ = auVar106._20_4_ * 0.0;
          auVar47._24_4_ = auVar106._24_4_ * 0.0;
          auVar47._28_4_ = auVar106._28_4_;
          auVar76 = vfmsub231ps_fma(auVar47,ZEXT1632(auVar88),auVar90);
          auVar48._4_4_ = auVar75._4_4_ * auVar90._4_4_;
          auVar48._0_4_ = auVar75._0_4_ * auVar90._0_4_;
          auVar48._8_4_ = auVar75._8_4_ * auVar90._8_4_;
          auVar48._12_4_ = auVar75._12_4_ * auVar90._12_4_;
          auVar48._16_4_ = auVar90._16_4_ * 0.0;
          auVar48._20_4_ = auVar90._20_4_ * 0.0;
          auVar48._24_4_ = auVar90._24_4_ * 0.0;
          auVar48._28_4_ = auVar90._28_4_;
          auVar73 = vfmsub231ps_fma(auVar48,ZEXT1632(auVar74),auVar105);
          auVar105 = vfmadd231ps_avx512vl(ZEXT1632(auVar73),auVar98,ZEXT1632(auVar76));
          auVar105 = vfmadd231ps_avx512vl(auVar105,auVar98,ZEXT1632(auVar86));
          uVar23 = vcmpps_avx512vl(auVar105,auVar98,2);
          bVar57 = (byte)uVar23;
          fVar128 = (float)((uint)(bVar57 & 1) * auVar87._0_4_ |
                           (uint)!(bool)(bVar57 & 1) * auVar78._0_4_);
          bVar14 = (bool)((byte)(uVar23 >> 1) & 1);
          fVar130 = (float)((uint)bVar14 * auVar87._4_4_ | (uint)!bVar14 * auVar78._4_4_);
          bVar14 = (bool)((byte)(uVar23 >> 2) & 1);
          fVar133 = (float)((uint)bVar14 * auVar87._8_4_ | (uint)!bVar14 * auVar78._8_4_);
          bVar14 = (bool)((byte)(uVar23 >> 3) & 1);
          fVar134 = (float)((uint)bVar14 * auVar87._12_4_ | (uint)!bVar14 * auVar78._12_4_);
          auVar101 = ZEXT1632(CONCAT412(fVar134,CONCAT48(fVar133,CONCAT44(fVar130,fVar128))));
          fVar129 = (float)((uint)(bVar57 & 1) * auVar80._0_4_ |
                           (uint)!(bool)(bVar57 & 1) * auVar79._0_4_);
          bVar14 = (bool)((byte)(uVar23 >> 1) & 1);
          fVar132 = (float)((uint)bVar14 * auVar80._4_4_ | (uint)!bVar14 * auVar79._4_4_);
          bVar14 = (bool)((byte)(uVar23 >> 2) & 1);
          fVar131 = (float)((uint)bVar14 * auVar80._8_4_ | (uint)!bVar14 * auVar79._8_4_);
          bVar14 = (bool)((byte)(uVar23 >> 3) & 1);
          fVar135 = (float)((uint)bVar14 * auVar80._12_4_ | (uint)!bVar14 * auVar79._12_4_);
          auVar92 = ZEXT1632(CONCAT412(fVar135,CONCAT48(fVar131,CONCAT44(fVar132,fVar129))));
          auVar121._0_4_ =
               (float)((uint)(bVar57 & 1) * auVar104._0_4_ |
                      (uint)!(bool)(bVar57 & 1) * auVar20._0_4_);
          bVar14 = (bool)((byte)(uVar23 >> 1) & 1);
          auVar121._4_4_ = (float)((uint)bVar14 * auVar104._4_4_ | (uint)!bVar14 * auVar20._4_4_);
          bVar14 = (bool)((byte)(uVar23 >> 2) & 1);
          auVar121._8_4_ = (float)((uint)bVar14 * auVar104._8_4_ | (uint)!bVar14 * auVar20._8_4_);
          bVar14 = (bool)((byte)(uVar23 >> 3) & 1);
          auVar121._12_4_ = (float)((uint)bVar14 * auVar104._12_4_ | (uint)!bVar14 * auVar20._12_4_)
          ;
          fVar169 = (float)((uint)((byte)(uVar23 >> 4) & 1) * auVar104._16_4_);
          auVar121._16_4_ = fVar169;
          fVar164 = (float)((uint)((byte)(uVar23 >> 5) & 1) * auVar104._20_4_);
          auVar121._20_4_ = fVar164;
          fVar146 = (float)((uint)((byte)(uVar23 >> 6) & 1) * auVar104._24_4_);
          auVar121._24_4_ = fVar146;
          iVar2 = (uint)(byte)(uVar23 >> 7) * auVar104._28_4_;
          auVar121._28_4_ = iVar2;
          auVar105 = vblendmps_avx512vl(ZEXT1632(auVar74),auVar102);
          auVar122._0_4_ =
               (uint)(bVar57 & 1) * auVar105._0_4_ | (uint)!(bool)(bVar57 & 1) * auVar86._0_4_;
          bVar14 = (bool)((byte)(uVar23 >> 1) & 1);
          auVar122._4_4_ = (uint)bVar14 * auVar105._4_4_ | (uint)!bVar14 * auVar86._4_4_;
          bVar14 = (bool)((byte)(uVar23 >> 2) & 1);
          auVar122._8_4_ = (uint)bVar14 * auVar105._8_4_ | (uint)!bVar14 * auVar86._8_4_;
          bVar14 = (bool)((byte)(uVar23 >> 3) & 1);
          auVar122._12_4_ = (uint)bVar14 * auVar105._12_4_ | (uint)!bVar14 * auVar86._12_4_;
          auVar122._16_4_ = (uint)((byte)(uVar23 >> 4) & 1) * auVar105._16_4_;
          auVar122._20_4_ = (uint)((byte)(uVar23 >> 5) & 1) * auVar105._20_4_;
          auVar122._24_4_ = (uint)((byte)(uVar23 >> 6) & 1) * auVar105._24_4_;
          auVar122._28_4_ = (uint)(byte)(uVar23 >> 7) * auVar105._28_4_;
          auVar105 = vblendmps_avx512vl(ZEXT1632(auVar75),ZEXT1632(auVar8));
          auVar123._0_4_ =
               (float)((uint)(bVar57 & 1) * auVar105._0_4_ |
                      (uint)!(bool)(bVar57 & 1) * auVar87._0_4_);
          bVar14 = (bool)((byte)(uVar23 >> 1) & 1);
          auVar123._4_4_ = (float)((uint)bVar14 * auVar105._4_4_ | (uint)!bVar14 * auVar87._4_4_);
          bVar14 = (bool)((byte)(uVar23 >> 2) & 1);
          auVar123._8_4_ = (float)((uint)bVar14 * auVar105._8_4_ | (uint)!bVar14 * auVar87._8_4_);
          bVar14 = (bool)((byte)(uVar23 >> 3) & 1);
          auVar123._12_4_ = (float)((uint)bVar14 * auVar105._12_4_ | (uint)!bVar14 * auVar87._12_4_)
          ;
          fVar170 = (float)((uint)((byte)(uVar23 >> 4) & 1) * auVar105._16_4_);
          auVar123._16_4_ = fVar170;
          fVar171 = (float)((uint)((byte)(uVar23 >> 5) & 1) * auVar105._20_4_);
          auVar123._20_4_ = fVar171;
          fVar165 = (float)((uint)((byte)(uVar23 >> 6) & 1) * auVar105._24_4_);
          auVar123._24_4_ = fVar165;
          auVar123._28_4_ = (uint)(byte)(uVar23 >> 7) * auVar105._28_4_;
          auVar105 = vblendmps_avx512vl(ZEXT1632(auVar88),ZEXT1632(auVar77));
          auVar124._0_4_ =
               (float)((uint)(bVar57 & 1) * auVar105._0_4_ |
                      (uint)!(bool)(bVar57 & 1) * auVar80._0_4_);
          bVar14 = (bool)((byte)(uVar23 >> 1) & 1);
          auVar124._4_4_ = (float)((uint)bVar14 * auVar105._4_4_ | (uint)!bVar14 * auVar80._4_4_);
          bVar14 = (bool)((byte)(uVar23 >> 2) & 1);
          auVar124._8_4_ = (float)((uint)bVar14 * auVar105._8_4_ | (uint)!bVar14 * auVar80._8_4_);
          bVar14 = (bool)((byte)(uVar23 >> 3) & 1);
          auVar124._12_4_ = (float)((uint)bVar14 * auVar105._12_4_ | (uint)!bVar14 * auVar80._12_4_)
          ;
          fVar66 = (float)((uint)((byte)(uVar23 >> 4) & 1) * auVar105._16_4_);
          auVar124._16_4_ = fVar66;
          fVar67 = (float)((uint)((byte)(uVar23 >> 5) & 1) * auVar105._20_4_);
          auVar124._20_4_ = fVar67;
          fVar127 = (float)((uint)((byte)(uVar23 >> 6) & 1) * auVar105._24_4_);
          auVar124._24_4_ = fVar127;
          iVar3 = (uint)(byte)(uVar23 >> 7) * auVar105._28_4_;
          auVar124._28_4_ = iVar3;
          auVar125._0_4_ =
               (uint)(bVar57 & 1) * (int)auVar74._0_4_ | (uint)!(bool)(bVar57 & 1) * auVar102._0_4_;
          bVar14 = (bool)((byte)(uVar23 >> 1) & 1);
          auVar125._4_4_ = (uint)bVar14 * (int)auVar74._4_4_ | (uint)!bVar14 * auVar102._4_4_;
          bVar14 = (bool)((byte)(uVar23 >> 2) & 1);
          auVar125._8_4_ = (uint)bVar14 * (int)auVar74._8_4_ | (uint)!bVar14 * auVar102._8_4_;
          bVar14 = (bool)((byte)(uVar23 >> 3) & 1);
          auVar125._12_4_ = (uint)bVar14 * (int)auVar74._12_4_ | (uint)!bVar14 * auVar102._12_4_;
          auVar125._16_4_ = (uint)!(bool)((byte)(uVar23 >> 4) & 1) * auVar102._16_4_;
          auVar125._20_4_ = (uint)!(bool)((byte)(uVar23 >> 5) & 1) * auVar102._20_4_;
          auVar125._24_4_ = (uint)!(bool)((byte)(uVar23 >> 6) & 1) * auVar102._24_4_;
          auVar125._28_4_ = (uint)!SUB81(uVar23 >> 7,0) * auVar102._28_4_;
          bVar14 = (bool)((byte)(uVar23 >> 1) & 1);
          bVar17 = (bool)((byte)(uVar23 >> 2) & 1);
          bVar18 = (bool)((byte)(uVar23 >> 3) & 1);
          bVar15 = (bool)((byte)(uVar23 >> 1) & 1);
          bVar16 = (bool)((byte)(uVar23 >> 2) & 1);
          bVar19 = (bool)((byte)(uVar23 >> 3) & 1);
          auVar102 = vsubps_avx512vl(auVar125,auVar101);
          auVar106 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar18 * (int)auVar75._12_4_ |
                                                   (uint)!bVar18 * auVar8._12_4_,
                                                   CONCAT48((uint)bVar17 * (int)auVar75._8_4_ |
                                                            (uint)!bVar17 * auVar8._8_4_,
                                                            CONCAT44((uint)bVar14 *
                                                                     (int)auVar75._4_4_ |
                                                                     (uint)!bVar14 * auVar8._4_4_,
                                                                     (uint)(bVar57 & 1) *
                                                                     (int)auVar75._0_4_ |
                                                                     (uint)!(bool)(bVar57 & 1) *
                                                                     auVar8._0_4_)))),auVar92);
          auVar104 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar19 * (int)auVar88._12_4_ |
                                                   (uint)!bVar19 * auVar77._12_4_,
                                                   CONCAT48((uint)bVar16 * (int)auVar88._8_4_ |
                                                            (uint)!bVar16 * auVar77._8_4_,
                                                            CONCAT44((uint)bVar15 *
                                                                     (int)auVar88._4_4_ |
                                                                     (uint)!bVar15 * auVar77._4_4_,
                                                                     (uint)(bVar57 & 1) *
                                                                     (int)auVar88._0_4_ |
                                                                     (uint)!(bool)(bVar57 & 1) *
                                                                     auVar77._0_4_)))),auVar121);
          auVar103 = vsubps_avx(auVar101,auVar122);
          auVar90 = vsubps_avx(auVar92,auVar123);
          auVar91 = vsubps_avx(auVar121,auVar124);
          auVar49._4_4_ = auVar104._4_4_ * fVar130;
          auVar49._0_4_ = auVar104._0_4_ * fVar128;
          auVar49._8_4_ = auVar104._8_4_ * fVar133;
          auVar49._12_4_ = auVar104._12_4_ * fVar134;
          auVar49._16_4_ = auVar104._16_4_ * 0.0;
          auVar49._20_4_ = auVar104._20_4_ * 0.0;
          auVar49._24_4_ = auVar104._24_4_ * 0.0;
          auVar49._28_4_ = 0;
          auVar86 = vfmsub231ps_fma(auVar49,auVar121,auVar102);
          auVar155._0_4_ = fVar129 * auVar102._0_4_;
          auVar155._4_4_ = fVar132 * auVar102._4_4_;
          auVar155._8_4_ = fVar131 * auVar102._8_4_;
          auVar155._12_4_ = fVar135 * auVar102._12_4_;
          auVar155._16_4_ = auVar102._16_4_ * 0.0;
          auVar155._20_4_ = auVar102._20_4_ * 0.0;
          auVar155._24_4_ = auVar102._24_4_ * 0.0;
          auVar155._28_4_ = 0;
          auVar87 = vfmsub231ps_fma(auVar155,auVar101,auVar106);
          auVar105 = vfmadd231ps_avx512vl(ZEXT1632(auVar87),auVar98,ZEXT1632(auVar86));
          auVar158._0_4_ = auVar106._0_4_ * auVar121._0_4_;
          auVar158._4_4_ = auVar106._4_4_ * auVar121._4_4_;
          auVar158._8_4_ = auVar106._8_4_ * auVar121._8_4_;
          auVar158._12_4_ = auVar106._12_4_ * auVar121._12_4_;
          auVar158._16_4_ = auVar106._16_4_ * fVar169;
          auVar158._20_4_ = auVar106._20_4_ * fVar164;
          auVar158._24_4_ = auVar106._24_4_ * fVar146;
          auVar158._28_4_ = 0;
          auVar86 = vfmsub231ps_fma(auVar158,auVar92,auVar104);
          auVar93 = vfmadd231ps_avx512vl(auVar105,auVar98,ZEXT1632(auVar86));
          auVar105 = vmulps_avx512vl(auVar91,auVar122);
          auVar105 = vfmsub231ps_avx512vl(auVar105,auVar103,auVar124);
          auVar50._4_4_ = auVar90._4_4_ * auVar124._4_4_;
          auVar50._0_4_ = auVar90._0_4_ * auVar124._0_4_;
          auVar50._8_4_ = auVar90._8_4_ * auVar124._8_4_;
          auVar50._12_4_ = auVar90._12_4_ * auVar124._12_4_;
          auVar50._16_4_ = auVar90._16_4_ * fVar66;
          auVar50._20_4_ = auVar90._20_4_ * fVar67;
          auVar50._24_4_ = auVar90._24_4_ * fVar127;
          auVar50._28_4_ = iVar3;
          auVar86 = vfmsub231ps_fma(auVar50,auVar123,auVar91);
          auVar159._0_4_ = auVar123._0_4_ * auVar103._0_4_;
          auVar159._4_4_ = auVar123._4_4_ * auVar103._4_4_;
          auVar159._8_4_ = auVar123._8_4_ * auVar103._8_4_;
          auVar159._12_4_ = auVar123._12_4_ * auVar103._12_4_;
          auVar159._16_4_ = fVar170 * auVar103._16_4_;
          auVar159._20_4_ = fVar171 * auVar103._20_4_;
          auVar159._24_4_ = fVar165 * auVar103._24_4_;
          auVar159._28_4_ = 0;
          auVar87 = vfmsub231ps_fma(auVar159,auVar90,auVar122);
          auVar105 = vfmadd231ps_avx512vl(ZEXT1632(auVar87),auVar98,auVar105);
          auVar94 = vfmadd231ps_avx512vl(auVar105,auVar98,ZEXT1632(auVar86));
          auVar105 = vmaxps_avx(auVar93,auVar94);
          uVar139 = vcmpps_avx512vl(auVar105,auVar98,2);
          bVar65 = bVar65 & (byte)uVar139;
          if (bVar65 != 0) {
            auVar51._4_4_ = auVar91._4_4_ * auVar106._4_4_;
            auVar51._0_4_ = auVar91._0_4_ * auVar106._0_4_;
            auVar51._8_4_ = auVar91._8_4_ * auVar106._8_4_;
            auVar51._12_4_ = auVar91._12_4_ * auVar106._12_4_;
            auVar51._16_4_ = auVar91._16_4_ * auVar106._16_4_;
            auVar51._20_4_ = auVar91._20_4_ * auVar106._20_4_;
            auVar51._24_4_ = auVar91._24_4_ * auVar106._24_4_;
            auVar51._28_4_ = auVar105._28_4_;
            auVar80 = vfmsub231ps_fma(auVar51,auVar90,auVar104);
            auVar52._4_4_ = auVar104._4_4_ * auVar103._4_4_;
            auVar52._0_4_ = auVar104._0_4_ * auVar103._0_4_;
            auVar52._8_4_ = auVar104._8_4_ * auVar103._8_4_;
            auVar52._12_4_ = auVar104._12_4_ * auVar103._12_4_;
            auVar52._16_4_ = auVar104._16_4_ * auVar103._16_4_;
            auVar52._20_4_ = auVar104._20_4_ * auVar103._20_4_;
            auVar52._24_4_ = auVar104._24_4_ * auVar103._24_4_;
            auVar52._28_4_ = auVar104._28_4_;
            auVar87 = vfmsub231ps_fma(auVar52,auVar102,auVar91);
            auVar53._4_4_ = auVar90._4_4_ * auVar102._4_4_;
            auVar53._0_4_ = auVar90._0_4_ * auVar102._0_4_;
            auVar53._8_4_ = auVar90._8_4_ * auVar102._8_4_;
            auVar53._12_4_ = auVar90._12_4_ * auVar102._12_4_;
            auVar53._16_4_ = auVar90._16_4_ * auVar102._16_4_;
            auVar53._20_4_ = auVar90._20_4_ * auVar102._20_4_;
            auVar53._24_4_ = auVar90._24_4_ * auVar102._24_4_;
            auVar53._28_4_ = auVar90._28_4_;
            auVar8 = vfmsub231ps_fma(auVar53,auVar103,auVar106);
            auVar86 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar87),ZEXT1632(auVar8));
            auVar105 = vfmadd231ps_avx512vl(ZEXT1632(auVar86),ZEXT1632(auVar80),auVar98);
            auVar106 = vrcp14ps_avx512vl(auVar105);
            auVar103 = auVar190._0_32_;
            auVar104 = vfnmadd213ps_avx512vl(auVar106,auVar105,auVar103);
            auVar86 = vfmadd132ps_fma(auVar104,auVar106,auVar106);
            auVar54._4_4_ = auVar8._4_4_ * auVar121._4_4_;
            auVar54._0_4_ = auVar8._0_4_ * auVar121._0_4_;
            auVar54._8_4_ = auVar8._8_4_ * auVar121._8_4_;
            auVar54._12_4_ = auVar8._12_4_ * auVar121._12_4_;
            auVar54._16_4_ = fVar169 * 0.0;
            auVar54._20_4_ = fVar164 * 0.0;
            auVar54._24_4_ = fVar146 * 0.0;
            auVar54._28_4_ = iVar2;
            auVar87 = vfmadd231ps_fma(auVar54,auVar92,ZEXT1632(auVar87));
            auVar87 = vfmadd231ps_fma(ZEXT1632(auVar87),auVar101,ZEXT1632(auVar80));
            fVar146 = auVar86._0_4_;
            fVar169 = auVar86._4_4_;
            fVar170 = auVar86._8_4_;
            fVar171 = auVar86._12_4_;
            local_220 = ZEXT1632(CONCAT412(auVar87._12_4_ * fVar171,
                                           CONCAT48(auVar87._8_4_ * fVar170,
                                                    CONCAT44(auVar87._4_4_ * fVar169,
                                                             auVar87._0_4_ * fVar146))));
            uVar139 = vcmpps_avx512vl(local_220,local_2e0,0xd);
            fVar164 = ray->tfar;
            auVar27._4_4_ = fVar164;
            auVar27._0_4_ = fVar164;
            auVar27._8_4_ = fVar164;
            auVar27._12_4_ = fVar164;
            auVar27._16_4_ = fVar164;
            auVar27._20_4_ = fVar164;
            auVar27._24_4_ = fVar164;
            auVar27._28_4_ = fVar164;
            uVar22 = vcmpps_avx512vl(local_220,auVar27,2);
            bVar65 = (byte)uVar139 & (byte)uVar22 & bVar65;
            if (bVar65 != 0) {
              uVar139 = vcmpps_avx512vl(auVar105,auVar98,4);
              bVar65 = bVar65 & (byte)uVar139;
              auVar189 = ZEXT3264(local_420);
              auVar195 = ZEXT3264(local_4a0);
              auVar196 = ZEXT3264(local_440);
              auVar197 = ZEXT3264(local_460);
              auVar188 = ZEXT3264(local_3c0);
              auVar194 = ZEXT3264(local_480);
              if (bVar65 != 0) {
                fVar164 = auVar93._0_4_ * fVar146;
                fVar165 = auVar93._4_4_ * fVar169;
                auVar55._4_4_ = fVar165;
                auVar55._0_4_ = fVar164;
                fVar66 = auVar93._8_4_ * fVar170;
                auVar55._8_4_ = fVar66;
                fVar67 = auVar93._12_4_ * fVar171;
                auVar55._12_4_ = fVar67;
                fVar127 = auVar93._16_4_ * 0.0;
                auVar55._16_4_ = fVar127;
                fVar128 = auVar93._20_4_ * 0.0;
                auVar55._20_4_ = fVar128;
                fVar129 = auVar93._24_4_ * 0.0;
                auVar55._24_4_ = fVar129;
                auVar55._28_4_ = auVar105._28_4_;
                auVar106 = vsubps_avx512vl(auVar103,auVar55);
                local_260._0_4_ =
                     (float)((uint)(bVar57 & 1) * (int)fVar164 |
                            (uint)!(bool)(bVar57 & 1) * auVar106._0_4_);
                bVar14 = (bool)((byte)(uVar23 >> 1) & 1);
                local_260._4_4_ =
                     (float)((uint)bVar14 * (int)fVar165 | (uint)!bVar14 * auVar106._4_4_);
                bVar14 = (bool)((byte)(uVar23 >> 2) & 1);
                local_260._8_4_ =
                     (float)((uint)bVar14 * (int)fVar66 | (uint)!bVar14 * auVar106._8_4_);
                bVar14 = (bool)((byte)(uVar23 >> 3) & 1);
                local_260._12_4_ =
                     (float)((uint)bVar14 * (int)fVar67 | (uint)!bVar14 * auVar106._12_4_);
                bVar14 = (bool)((byte)(uVar23 >> 4) & 1);
                local_260._16_4_ =
                     (float)((uint)bVar14 * (int)fVar127 | (uint)!bVar14 * auVar106._16_4_);
                bVar14 = (bool)((byte)(uVar23 >> 5) & 1);
                local_260._20_4_ =
                     (float)((uint)bVar14 * (int)fVar128 | (uint)!bVar14 * auVar106._20_4_);
                bVar14 = (bool)((byte)(uVar23 >> 6) & 1);
                local_260._24_4_ =
                     (float)((uint)bVar14 * (int)fVar129 | (uint)!bVar14 * auVar106._24_4_);
                bVar14 = SUB81(uVar23 >> 7,0);
                local_260._28_4_ =
                     (float)((uint)bVar14 * auVar105._28_4_ | (uint)!bVar14 * auVar106._28_4_);
                auVar105 = vsubps_avx(ZEXT1632(auVar85),auVar97);
                auVar86 = vfmadd213ps_fma(auVar105,local_260,auVar97);
                fVar164 = local_520->depth_scale;
                auVar28._4_4_ = fVar164;
                auVar28._0_4_ = fVar164;
                auVar28._8_4_ = fVar164;
                auVar28._12_4_ = fVar164;
                auVar28._16_4_ = fVar164;
                auVar28._20_4_ = fVar164;
                auVar28._24_4_ = fVar164;
                auVar28._28_4_ = fVar164;
                auVar105 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar86._12_4_ + auVar86._12_4_,
                                                              CONCAT48(auVar86._8_4_ + auVar86._8_4_
                                                                       ,CONCAT44(auVar86._4_4_ +
                                                                                 auVar86._4_4_,
                                                                                 auVar86._0_4_ +
                                                                                 auVar86._0_4_)))),
                                           auVar28);
                uVar139 = vcmpps_avx512vl(local_220,auVar105,6);
                if (((byte)uVar139 & bVar65) != 0) {
                  auVar145._0_4_ = auVar94._0_4_ * fVar146;
                  auVar145._4_4_ = auVar94._4_4_ * fVar169;
                  auVar145._8_4_ = auVar94._8_4_ * fVar170;
                  auVar145._12_4_ = auVar94._12_4_ * fVar171;
                  auVar145._16_4_ = auVar94._16_4_ * 0.0;
                  auVar145._20_4_ = auVar94._20_4_ * 0.0;
                  auVar145._24_4_ = auVar94._24_4_ * 0.0;
                  auVar145._28_4_ = 0;
                  auVar105 = vsubps_avx512vl(auVar103,auVar145);
                  auVar126._0_4_ =
                       (uint)(bVar57 & 1) * (int)auVar145._0_4_ |
                       (uint)!(bool)(bVar57 & 1) * auVar105._0_4_;
                  bVar14 = (bool)((byte)(uVar23 >> 1) & 1);
                  auVar126._4_4_ =
                       (uint)bVar14 * (int)auVar145._4_4_ | (uint)!bVar14 * auVar105._4_4_;
                  bVar14 = (bool)((byte)(uVar23 >> 2) & 1);
                  auVar126._8_4_ =
                       (uint)bVar14 * (int)auVar145._8_4_ | (uint)!bVar14 * auVar105._8_4_;
                  bVar14 = (bool)((byte)(uVar23 >> 3) & 1);
                  auVar126._12_4_ =
                       (uint)bVar14 * (int)auVar145._12_4_ | (uint)!bVar14 * auVar105._12_4_;
                  bVar14 = (bool)((byte)(uVar23 >> 4) & 1);
                  auVar126._16_4_ =
                       (uint)bVar14 * (int)auVar145._16_4_ | (uint)!bVar14 * auVar105._16_4_;
                  bVar14 = (bool)((byte)(uVar23 >> 5) & 1);
                  auVar126._20_4_ =
                       (uint)bVar14 * (int)auVar145._20_4_ | (uint)!bVar14 * auVar105._20_4_;
                  bVar14 = (bool)((byte)(uVar23 >> 6) & 1);
                  auVar126._24_4_ =
                       (uint)bVar14 * (int)auVar145._24_4_ | (uint)!bVar14 * auVar105._24_4_;
                  auVar126._28_4_ = (uint)!SUB81(uVar23 >> 7,0) * auVar105._28_4_;
                  auVar29._8_4_ = 0x40000000;
                  auVar29._0_8_ = 0x4000000040000000;
                  auVar29._12_4_ = 0x40000000;
                  auVar29._16_4_ = 0x40000000;
                  auVar29._20_4_ = 0x40000000;
                  auVar29._24_4_ = 0x40000000;
                  auVar29._28_4_ = 0x40000000;
                  local_240 = vfmsub132ps_avx512vl(auVar126,auVar103,auVar29);
                  local_200 = (int)lVar62;
                  local_1fc = iVar9;
                  local_1f0 = local_3d0._0_8_;
                  uStack_1e8 = local_3d0._8_8_;
                  local_1e0 = local_3e0._0_8_;
                  uStack_1d8 = local_3e0._8_8_;
                  local_1d0 = local_3f0._0_8_;
                  uStack_1c8 = local_3f0._8_8_;
                  pGVar10 = (local_540->scene->geometries).items[uVar58].ptr;
                  if ((pGVar10->mask & ray->mask) == 0) {
                    bVar57 = 0;
                  }
                  else if ((local_540->args->filter != (RTCFilterFunctionN)0x0) ||
                          (bVar57 = 1, pGVar10->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    auVar86 = vcvtsi2ss_avx512f(auVar190._0_16_,(int)lVar62);
                    fVar164 = auVar86._0_4_;
                    local_1a0[0] = (fVar164 + local_260._0_4_ + 0.0) * (float)local_300._0_4_;
                    local_1a0[1] = (fVar164 + local_260._4_4_ + 1.0) * (float)local_300._4_4_;
                    local_1a0[2] = (fVar164 + local_260._8_4_ + 2.0) * fStack_2f8;
                    local_1a0[3] = (fVar164 + local_260._12_4_ + 3.0) * fStack_2f4;
                    fStack_190 = (fVar164 + local_260._16_4_ + 4.0) * fStack_2f0;
                    fStack_18c = (fVar164 + local_260._20_4_ + 5.0) * fStack_2ec;
                    fStack_188 = (fVar164 + local_260._24_4_ + 6.0) * fStack_2e8;
                    fStack_184 = fVar164 + local_260._28_4_ + 7.0;
                    local_180 = local_240;
                    local_160 = local_220;
                    uVar58 = 0;
                    uVar59 = (ulong)((byte)uVar139 & bVar65);
                    for (uVar23 = uVar59; (uVar23 & 1) == 0;
                        uVar23 = uVar23 >> 1 | 0x8000000000000000) {
                      uVar58 = uVar58 + 1;
                    }
                    local_4b0 = pGVar10;
                    while( true ) {
                      local_400._0_8_ = uVar59;
                      if (uVar59 == 0) break;
                      local_4d4 = local_1a0[uVar58];
                      local_4d0 = *(undefined4 *)(local_180 + uVar58 * 4);
                      local_514 = ray->tfar;
                      local_370 = uVar58;
                      ray->tfar = *(float *)(local_160 + uVar58 * 4);
                      local_510.context = local_540->user;
                      auVar86 = vsubss_avx512f(ZEXT416(0x3f800000),ZEXT416((uint)local_4d4));
                      fVar146 = auVar86._0_4_;
                      fVar164 = fVar146 * fVar146 * -3.0;
                      auVar86 = vfmadd231ss_fma(ZEXT416((uint)(fVar146 * fVar146)),
                                                ZEXT416((uint)(local_4d4 * fVar146)),
                                                ZEXT416(0xc0000000));
                      auVar85 = vfmsub132ss_fma(ZEXT416((uint)(local_4d4 * fVar146)),
                                                ZEXT416((uint)(local_4d4 * local_4d4)),
                                                ZEXT416(0x40000000));
                      fVar146 = auVar86._0_4_ * 3.0;
                      fVar169 = auVar85._0_4_ * 3.0;
                      fVar170 = local_4d4 * local_4d4 * 3.0;
                      auVar163._0_4_ = fVar170 * (float)local_310._0_4_;
                      auVar163._4_4_ = fVar170 * (float)local_310._4_4_;
                      auVar163._8_4_ = fVar170 * fStack_308;
                      auVar163._12_4_ = fVar170 * fStack_304;
                      auVar149._4_4_ = fVar169;
                      auVar149._0_4_ = fVar169;
                      auVar149._8_4_ = fVar169;
                      auVar149._12_4_ = fVar169;
                      auVar86 = vfmadd132ps_fma(auVar149,auVar163,local_3f0);
                      auVar153._4_4_ = fVar146;
                      auVar153._0_4_ = fVar146;
                      auVar153._8_4_ = fVar146;
                      auVar153._12_4_ = fVar146;
                      auVar86 = vfmadd132ps_fma(auVar153,auVar86,local_3e0);
                      auVar150._4_4_ = fVar164;
                      auVar150._0_4_ = fVar164;
                      auVar150._8_4_ = fVar164;
                      auVar150._12_4_ = fVar164;
                      auVar86 = vfmadd132ps_fma(auVar150,auVar86,local_3d0);
                      local_4e0 = vmovlps_avx(auVar86);
                      local_4d8 = vextractps_avx(auVar86,2);
                      local_4cc = (int)local_4a8;
                      local_4c8 = (int)local_528;
                      local_4c4 = (local_510.context)->instID[0];
                      local_4c0 = (local_510.context)->instPrimID[0];
                      local_544 = -1;
                      local_510.valid = &local_544;
                      local_510.geometryUserPtr = local_4b0->userPtr;
                      local_510.ray = (RTCRayN *)ray;
                      local_510.hit = (RTCHitN *)&local_4e0;
                      local_510.N = 1;
                      if ((local_4b0->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                         ((*local_4b0->occlusionFilterN)(&local_510), *local_510.valid != 0)) {
                        auVar86 = auVar191._0_16_;
                        p_Var13 = local_540->args->filter;
                        if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                           (((local_540->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((local_4b0->field_8).field_0x2 & 0x40) != 0)))) {
                          (*p_Var13)(&local_510);
                          auVar86 = auVar191._0_16_;
                          if (*local_510.valid == 0) goto LAB_018ab7d2;
                        }
                        bVar57 = 1;
                        auVar105 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                        auVar86 = vxorps_avx512vl(auVar86,auVar86);
                        ray = local_530;
                        goto LAB_018ab8b2;
                      }
LAB_018ab7d2:
                      local_530->tfar = local_514;
                      uVar58 = 0;
                      uVar59 = local_400._0_8_ ^ 1L << (local_370 & 0x3f);
                      for (uVar23 = uVar59; ray = local_530, (uVar23 & 1) == 0;
                          uVar23 = uVar23 >> 1 | 0x8000000000000000) {
                        uVar58 = uVar58 + 1;
                      }
                    }
                    bVar57 = 0;
                    auVar105 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                    auVar86 = vxorps_avx512vl(auVar191._0_16_,auVar191._0_16_);
LAB_018ab8b2:
                    auVar191 = ZEXT1664(auVar86);
                    auVar190 = ZEXT3264(auVar105);
                    auVar192 = ZEXT3264(local_340);
                    auVar193 = ZEXT3264(local_360);
                    auVar189 = ZEXT3264(local_420);
                    auVar195 = ZEXT3264(local_4a0);
                    auVar196 = ZEXT3264(local_440);
                    auVar197 = ZEXT3264(local_460);
                    auVar188 = ZEXT3264(local_3c0);
                    auVar194 = ZEXT3264(local_480);
                    uVar58 = local_528;
                  }
                  bVar64 = (bool)(bVar64 | bVar57);
                }
              }
              goto LAB_018ab821;
            }
          }
          auVar189 = ZEXT3264(local_420);
          auVar195 = ZEXT3264(local_4a0);
          auVar196 = ZEXT3264(local_440);
          auVar197 = ZEXT3264(local_460);
          auVar188 = ZEXT3264(local_3c0);
          auVar194 = ZEXT3264(local_480);
        }
LAB_018ab821:
      }
    }
    if (bVar64) break;
    fVar164 = ray->tfar;
    auVar24._4_4_ = fVar164;
    auVar24._0_4_ = fVar164;
    auVar24._8_4_ = fVar164;
    auVar24._12_4_ = fVar164;
    uVar139 = vcmpps_avx512vl(local_270,auVar24,2);
  }
  return uVar63 != 0;
}

Assistant:

static __forceinline bool occluded_t(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time());

          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID)))
              return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }